

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf.c
# Opt level: O1

int read_file(coda_product *product)

{
  ulong index;
  long *plVar1;
  undefined4 uVar2;
  char cVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 field_type;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined7 uVar14;
  char cVar15;
  undefined3 uVar16;
  undefined3 uVar17;
  undefined1 uVar18;
  undefined2 uVar19;
  int iVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  coda_mem_data *pcVar24;
  coda_type_record *pcVar25;
  coda_type_record_field *pcVar26;
  coda_mem_array *pcVar27;
  size_t sVar28;
  coda_mem_special *pcVar29;
  coda_type_array *pcVar30;
  coda_mem_record *pcVar31;
  char *pcVar32;
  undefined1 field_type_00 [8];
  char *message;
  undefined8 *puVar33;
  ulong uVar34;
  bool bVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  double double_value;
  int64_t int_value;
  char line [1000];
  undefined8 uStack_5f0;
  char local_5e8;
  char cStack_5e7;
  char cStack_5e6;
  char cStack_5e5;
  char cStack_5e4;
  char cStack_5e3;
  undefined1 uStack_5e2;
  undefined1 uStack_5e1;
  undefined7 uStack_5e0;
  char cStack_5d9;
  uint5 local_5d8;
  undefined3 uStack_5d3;
  undefined3 uStack_5d0;
  undefined5 uStack_5cd;
  undefined3 uStack_5c8;
  undefined5 uStack_5c5;
  undefined1 uStack_5c0;
  undefined2 uStack_5bf;
  undefined1 uStack_5bd;
  undefined4 uStack_5b8;
  undefined8 uStack_5b4;
  undefined1 local_5ac;
  int32_t local_5a0;
  undefined4 uStack_59c;
  int32_t local_598 [2];
  undefined1 local_590 [48];
  undefined1 local_560 [12];
  undefined4 uStack_554;
  coda_mem_array *local_550;
  int iStack_548;
  undefined1 local_540 [16];
  undefined1 local_530 [12];
  undefined4 uStack_524;
  coda_mem_array *local_520;
  int iStack_518;
  undefined1 local_510 [16];
  undefined1 local_500 [12];
  undefined4 uStack_4f4;
  coda_mem_array *local_4f0;
  int iStack_4e8;
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [8];
  double dStack_4b8;
  char local_4b0;
  char cStack_4af;
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  undefined1 local_488 [8];
  coda_mem_array *pcStack_480;
  undefined1 local_478 [16];
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  char local_438 [3];
  char cStack_435;
  char cStack_434;
  char acStack_433 [9];
  char acStack_42a [2];
  undefined4 local_428;
  undefined4 uStack_424;
  undefined4 uStack_420;
  undefined4 uStack_41c;
  undefined4 uStack_418;
  undefined4 uStack_414;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  undefined2 uStack_408;
  char cStack_406;
  undefined4 uStack_405;
  char cStack_401;
  undefined2 local_400;
  char cStack_3fe;
  undefined1 uStack_3fd;
  char local_3fc;
  char cStack_3fb;
  char cStack_3fa;
  char cStack_3f9;
  char cStack_3f8;
  char cStack_3f7;
  char cStack_3f6;
  char cStack_3f5;
  char cStack_3f4;
  char cStack_3f3;
  char cStack_3f2;
  char cStack_3f1;
  char cStack_3f0;
  char cStack_3ef;
  char cStack_3ee;
  char cStack_3ed;
  char local_3ec;
  char cStack_3eb;
  char cStack_3ea;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_590._0_8_ = (FILE *)0x0;
  local_590._16_8_ = (coda_mem_record *)0x0;
  local_590._24_4_ = 0;
  local_590._32_16_ = (undefined1  [16])0x0;
  local_560 = SUB1612((undefined1  [16])0x0,0);
  uStack_554 = 0;
  local_550 = (coda_mem_array *)0x0;
  iStack_548 = 0;
  local_540 = (undefined1  [16])0x0;
  local_530 = SUB1612((undefined1  [16])0x0,0);
  uStack_524 = 0;
  local_520 = (coda_mem_array *)0x0;
  iStack_518 = 0;
  local_510 = (undefined1  [16])0x0;
  local_500 = SUB1612((undefined1  [16])0x0,0);
  uStack_4f4 = 0;
  local_4f0 = (coda_mem_array *)0x0;
  iStack_4e8 = 0;
  local_4e0 = (undefined1  [16])0x0;
  local_4d0 = (undefined1  [16])0x0;
  _local_4c0 = (undefined1  [16])0x0;
  local_4b0 = ' ';
  cStack_4af = ' ';
  local_4a8 = (undefined1  [16])0x0;
  local_498 = (undefined1  [16])0x0;
  _local_488 = (undefined1  [16])0x0;
  local_478 = (undefined1  [16])0x0;
  uStack_5f0 = 0x155151;
  local_590._8_8_ = product;
  local_590._0_8_ = fopen(product->filename,"r");
  if ((FILE *)local_590._0_8_ == (FILE *)0x0) {
    uStack_5f0 = 0x1551c4;
    coda_set_error(-0x15,"could not open file %s",product->filename);
    return -1;
  }
  uStack_5f0 = 0x155163;
  lVar22 = ftell((FILE *)local_590._0_8_);
  local_4a8._0_8_ = local_4a8._0_8_ + 1;
  uStack_5f0 = 0x155185;
  local_4a8._8_8_ = lVar22;
  iVar20 = get_line((FILE *)local_590._0_8_,local_438);
  if (iVar20 < 0) goto LAB_00155226;
  if (iVar20 < 0x3d) {
    pcVar32 = (char *)(long)iVar20;
    goto LAB_00155195;
  }
  auVar68[0] = -((char)_local_3ec == 'T');
  auVar68[1] = -((char)((uint)_local_3ec >> 8) == 'Y');
  auVar68[2] = -((char)((uint)_local_3ec >> 0x10) == 'P');
  auVar68[3] = -((char)((uint)_local_3ec >> 0x18) == 'E');
  auVar68[4] = 0xff;
  auVar68[5] = 0xff;
  auVar68[6] = 0xff;
  auVar68[7] = 0xff;
  auVar68[8] = 0xff;
  auVar68[9] = 0xff;
  auVar68[10] = 0xff;
  auVar68[0xb] = 0xff;
  auVar68[0xc] = 0xff;
  auVar68[0xd] = 0xff;
  auVar68[0xe] = 0xff;
  auVar68[0xf] = 0xff;
  auVar36[0] = -(local_3fc == 'R');
  auVar36[1] = -(cStack_3fb == 'I');
  auVar36[2] = -(cStack_3fa == 'N');
  auVar36[3] = -(cStack_3f9 == 'E');
  auVar36[4] = -(cStack_3f8 == 'X');
  auVar36[5] = -(cStack_3f7 == ' ');
  auVar36[6] = -(cStack_3f6 == 'V');
  auVar36[7] = -(cStack_3f5 == 'E');
  auVar36[8] = -(cStack_3f4 == 'R');
  auVar36[9] = -(cStack_3f3 == 'S');
  auVar36[10] = -(cStack_3f2 == 'I');
  auVar36[0xb] = -(cStack_3f1 == 'O');
  auVar36[0xc] = -(cStack_3f0 == 'N');
  auVar36[0xd] = -(cStack_3ef == ' ');
  auVar36[0xe] = -(cStack_3ee == '/');
  auVar36[0xf] = -(cStack_3ed == ' ');
  auVar36 = auVar36 & auVar68;
  if ((ushort)((ushort)(SUB161(auVar36 >> 7,0) & 1) | (ushort)(SUB161(auVar36 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar36 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar36 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar36 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar36 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar36 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar36 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar36 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar36 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar36 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar36 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar36 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar36 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar36 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar36[0xf] >> 7) << 0xf) == 0xffff) {
    uStack_5f0 = 0x155263;
    lVar23 = coda_ascii_parse_double(local_438,9,(double *)(local_4c0 + 8),0);
    lVar22 = local_4a8._8_8_;
    if (lVar23 < 0) {
LAB_0015768f:
      uStack_5f0 = 0x15769d;
      coda_add_error_message(" (line: %ld, byte offset: %ld)",local_4a8._0_8_,lVar22);
      goto LAB_00155226;
    }
    local_4b0 = (char)uStack_424;
    uVar21 = uStack_424 & 0xff;
    if (uVar21 == 0x43) {
      lVar22 = 0x470;
      if (((dStack_4b8 == 2.0) && (!NAN(dStack_4b8))) || ((dStack_4b8 == 3.0 && (!NAN(dStack_4b8))))
         ) {
LAB_00155332:
        uStack_5f0 = 0x15533e;
        lVar23 = __tls_get_addr(&PTR_001e0d10);
        uStack_5f0 = 0x155356;
        local_590._16_8_ =
             coda_mem_record_new(*(coda_type_record **)(*(long *)(lVar23 + 0x1118) + lVar22),
                                 (coda_dynamic_type *)0x0);
        uVar2 = uStack_410;
        if (dStack_4b8 != 3.0) {
          uVar2 = 0x47;
        }
        cStack_4af = (char)uVar2;
        if (NAN(dStack_4b8)) {
          cStack_4af = 'G';
        }
        uStack_5f0 = 0x15539f;
        pcVar24 = coda_mem_float_new((coda_type_number *)**(undefined8 **)(lVar23 + 0x1118),
                                     (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                     (float)dStack_4b8);
        uStack_5f0 = 0x1553b5;
        coda_mem_record_add_field
                  ((coda_mem_record *)local_590._16_8_,"format_version",(coda_dynamic_type *)pcVar24
                   ,0);
        uStack_5f0 = 0x1553d4;
        pcVar24 = coda_mem_char_new(*(coda_type_text **)(*(long *)(lVar23 + 0x1118) + 8),
                                    (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                    local_4b0);
        uStack_5f0 = 0x1553ea;
        coda_mem_record_add_field
                  ((coda_mem_record *)local_590._16_8_,"file_type",(coda_dynamic_type *)pcVar24,0);
        uStack_5f0 = 0x155409;
        pcVar24 = coda_mem_char_new(*(coda_type_text **)(*(long *)(lVar23 + 0x1118) + 0x10),
                                    (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                    cStack_4af);
        uStack_5f0 = 0x15541f;
        coda_mem_record_add_field
                  ((coda_mem_record *)local_590._16_8_,"satellite_system",
                   (coda_dynamic_type *)pcVar24,0);
        if (local_4b0 == 'N') {
          uStack_5f0 = 0x1566e3;
          pcVar25 = coda_type_record_new(coda_format_rinex);
          local_498._0_8_ = pcVar25;
          uStack_5f0 = 0x1566f7;
          pcVar26 = coda_type_record_field_new("epoch");
          uStack_5f0 = 0x156710;
          coda_type_record_field_set_type
                    (pcVar26,*(coda_type **)(*(long *)(lVar23 + 0x1118) + 0x168));
          uStack_5f0 = 0x156720;
          coda_type_record_add_field((coda_type_record *)local_498._0_8_,pcVar26);
          uStack_5f0 = 0x15672c;
          pcVar26 = coda_type_record_field_new("flag");
          uStack_5f0 = 0x156745;
          coda_type_record_field_set_type
                    (pcVar26,*(coda_type **)(*(long *)(lVar23 + 0x1118) + 0x170));
          uStack_5f0 = 0x156755;
          coda_type_record_add_field((coda_type_record *)local_498._0_8_,pcVar26);
          uStack_5f0 = 0x156761;
          pcVar26 = coda_type_record_field_new("receiver_clock_offset");
          uStack_5f0 = 0x15677a;
          coda_type_record_field_set_type
                    (pcVar26,*(coda_type **)(*(long *)(lVar23 + 0x1118) + 0x178));
          uStack_5f0 = 0x15678a;
          coda_type_record_add_field((coda_type_record *)local_498._0_8_,pcVar26);
          uStack_5f0 = 0x15679f;
          pcVar27 = coda_mem_array_new(*(coda_type_array **)(*(long *)(lVar23 + 0x1118) + 0x1d0),
                                       (coda_dynamic_type *)0x0);
          local_478._0_8_ = pcVar27;
          uStack_5f0 = 0x1567bc;
          pcVar27 = coda_mem_array_new(*(coda_type_array **)(*(long *)(lVar23 + 0x1118) + 0x218),
                                       (coda_dynamic_type *)0x0);
          local_478._8_8_ = pcVar27;
          uStack_5f0 = 0x1567ce;
          local_4a8._8_8_ = ftell((FILE *)local_590._0_8_);
          local_4a8._0_8_ = local_4a8._0_8_ + 1;
          uStack_5f0 = 0x1567f0;
          uVar21 = get_line((FILE *)local_590._0_8_,local_438);
          if (-1 < (int)uVar21) {
            plVar1 = (long *)(lVar23 + 0x1118);
            local_448 = 0x5552202f204d4750;
            uStack_440 = 0x44202f205942204e;
            local_458 = 0x42204e5552202f20;
            uStack_450 = 0x45544144202f2059;
            do {
              pcVar32 = &local_3fc;
              if (uVar21 == 0) {
LAB_001576fa:
                uStack_5f0 = 0x157718;
                coda_mem_record_add_field
                          ((coda_mem_record *)local_590._16_8_,"ionospheric_corr",
                           (coda_dynamic_type *)local_478._0_8_,0);
                field_type = local_478._8_8_;
                auVar5._8_8_ = 0;
                auVar5._0_8_ = local_478._8_8_;
                local_478 = auVar5 << 0x40;
                uStack_5f0 = 0x15773b;
                coda_mem_record_add_field
                          ((coda_mem_record *)local_590._16_8_,"time_system_corr",
                           (coda_dynamic_type *)field_type,0);
                local_478._8_8_ = 0;
                uStack_5f0 = 0x15774d;
                local_4a8._8_8_ = ftell((FILE *)local_590._0_8_);
                local_4a8._0_8_ = local_4a8._0_8_ + 1;
                uStack_5f0 = 0x157767;
                iVar20 = coda_mem_record_validate((coda_mem_record *)local_590._16_8_);
                if (iVar20 == 0) {
                  uStack_5f0 = 0x157781;
                  local_550 = coda_mem_array_new(*(coda_type_array **)(*plVar1 + 0x400),
                                                 (coda_dynamic_type *)0x0);
                  uStack_5f0 = 0x15779c;
                  local_520 = coda_mem_array_new(*(coda_type_array **)(*plVar1 + 0x408),
                                                 (coda_dynamic_type *)0x0);
                  uStack_5f0 = 0x1577b2;
                  local_4f0 = coda_mem_array_new(*(coda_type_array **)(*plVar1 + 0x410),
                                                 (coda_dynamic_type *)0x0);
                  uStack_5f0 = 0x1577cb;
                  pcVar27 = coda_mem_array_new(*(coda_type_array **)(*plVar1 + 0x418),
                                               (coda_dynamic_type *)0x0);
                  local_4c0 = (undefined1  [8])pcVar27;
                  uStack_5f0 = 0x1577da;
                  iVar20 = read_navigation_records((ingest_info *)local_590);
                  if (iVar20 == 0) {
                    puVar33 = (undefined8 *)local_4c0;
                    uStack_5f0 = 0x1577ff;
                    pcVar31 = coda_mem_record_new(*(coda_type_record **)(*plVar1 + 0x420),
                                                  (coda_dynamic_type *)0x0);
                    uStack_5f0 = 0x15781b;
                    coda_mem_record_add_field
                              (pcVar31,"header",(coda_dynamic_type *)local_590._16_8_,0);
                    local_590._16_8_ = (coda_mem_record *)0x0;
                    uStack_5f0 = 0x15783c;
                    coda_mem_record_add_field(pcVar31,"gps",(coda_dynamic_type *)local_550,0);
                    local_550 = (coda_mem_array *)0x0;
                    uStack_5f0 = 0x15785a;
                    coda_mem_record_add_field(pcVar31,"glonass",(coda_dynamic_type *)local_520,0);
                    local_520 = (coda_mem_array *)0x0;
                    uStack_5f0 = 0x157875;
                    coda_mem_record_add_field(pcVar31,"galileo",(coda_dynamic_type *)local_4f0,0);
                    local_4f0 = (coda_mem_array *)0x0;
                    pcVar32 = "sbas";
                    iVar20 = 0;
                    field_type_00 = local_4c0;
                    goto LAB_00157bc0;
                  }
                }
                break;
              }
              if (uVar21 < 0x3d) goto LAB_001576a2;
              auVar56[0] = -(local_3fc == (char)local_448);
              auVar56[1] = -(cStack_3fb == local_448._1_1_);
              auVar56[2] = -(cStack_3fa == local_448._2_1_);
              auVar56[3] = -(cStack_3f9 == local_448._3_1_);
              auVar56[4] = -(cStack_3f8 == local_448._4_1_);
              auVar56[5] = -(cStack_3f7 == local_448._5_1_);
              auVar56[6] = -(cStack_3f6 == local_448._6_1_);
              auVar56[7] = -(cStack_3f5 == local_448._7_1_);
              auVar56[8] = -(cStack_3f4 == (char)uStack_440);
              auVar56[9] = -(cStack_3f3 == uStack_440._1_1_);
              auVar56[10] = -(cStack_3f2 == uStack_440._2_1_);
              auVar56[0xb] = -(cStack_3f1 == uStack_440._3_1_);
              auVar56[0xc] = -(cStack_3f0 == uStack_440._4_1_);
              auVar56[0xd] = -(cStack_3ef == uStack_440._5_1_);
              auVar56[0xe] = -(cStack_3ee == uStack_440._6_1_);
              auVar56[0xf] = -(cStack_3ed == uStack_440._7_1_);
              auVar87[0] = -(cStack_3f9 == (char)local_458);
              auVar87[1] = -(cStack_3f8 == local_458._1_1_);
              auVar87[2] = -(cStack_3f7 == local_458._2_1_);
              auVar87[3] = -(cStack_3f6 == local_458._3_1_);
              auVar87[4] = -(cStack_3f5 == local_458._4_1_);
              auVar87[5] = -(cStack_3f4 == local_458._5_1_);
              auVar87[6] = -(cStack_3f3 == local_458._6_1_);
              auVar87[7] = -(cStack_3f2 == local_458._7_1_);
              auVar87[8] = -(cStack_3f1 == (char)uStack_450);
              auVar87[9] = -(cStack_3f0 == uStack_450._1_1_);
              auVar87[10] = -(cStack_3ef == uStack_450._2_1_);
              auVar87[0xb] = -(cStack_3ee == uStack_450._3_1_);
              auVar87[0xc] = -(cStack_3ed == uStack_450._4_1_);
              auVar87[0xd] = -(local_3ec == uStack_450._5_1_);
              auVar87[0xe] = -(cStack_3eb == uStack_450._6_1_);
              auVar87[0xf] = -(cStack_3ea == uStack_450._7_1_);
              auVar87 = auVar87 & auVar56;
              if ((ushort)((ushort)(SUB161(auVar87 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar87 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar87 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar87 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar87 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar87 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar87 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar87 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar87 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar87 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar87 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar87 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar87 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar87 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar87 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar87[0xf] >> 7) << 0xf) == 0xffff) {
                local_5e8 = (char)_local_438;
                cStack_5e7 = (char)((uint)_local_438 >> 8);
                cStack_5e6 = (char)((uint)_local_438 >> 0x10);
                cStack_5e5 = (char)((uint)_local_438 >> 0x18);
                uStack_5e2 = (undefined1)acStack_433._1_2_;
                uStack_5e1 = SUB21(acStack_433._1_2_,1);
                uStack_5e0 = (undefined7)stack0xfffffffffffffbd0;
                cStack_5d9 = (char)((ulong)stack0xfffffffffffffbd0 >> 0x38);
                local_5d8 = (uint5)local_428;
                uStack_5f0 = 0x1569b6;
                sVar28 = strlen(&local_5e8);
                if (0 < (long)sVar28) {
                  lVar22 = sVar28 + 1;
                  do {
                    if (*(char *)((long)&uStack_5f0 + lVar22 + 6) != ' ') break;
                    *(undefined1 *)((long)&uStack_5f0 + lVar22 + 6) = 0;
                    lVar22 = lVar22 + -1;
                  } while (1 < lVar22);
                }
                uStack_5f0 = 0x1569ea;
                pcVar24 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x18),
                                              (coda_dynamic_type *)0x0,
                                              (coda_product *)local_590._8_8_,&local_5e8);
                uStack_5f0 = 0x1569fc;
                coda_mem_record_add_field
                          ((coda_mem_record *)local_590._16_8_,"program",
                           (coda_dynamic_type *)pcVar24,0);
                local_5e8 = (char)uStack_424;
                cStack_5e7 = (char)(uStack_424 >> 8);
                cStack_5e6 = (char)(uStack_424 >> 0x10);
                cStack_5e5 = (char)(uStack_424 >> 0x18);
                cStack_5e4 = (char)uStack_420;
                cStack_5e3 = (char)((uint)uStack_420 >> 8);
                uStack_5e2 = (undefined1)((uint)uStack_420 >> 0x10);
                uStack_5e1 = (undefined1)((uint)uStack_420 >> 0x18);
                uStack_5e0 = (undefined7)CONCAT44(uStack_418,uStack_41c);
                cStack_5d9 = (char)((uint)uStack_418 >> 0x18);
                _local_5d8 = CONCAT44(stack0xfffffffffffffa2c,uStack_414);
                uStack_5f0 = 0x156a17;
                sVar28 = strlen(&local_5e8);
                if (0 < (long)sVar28) {
                  lVar22 = sVar28 + 1;
                  do {
                    if (*(char *)((long)&uStack_5f0 + lVar22 + 6) != ' ') break;
                    *(undefined1 *)((long)&uStack_5f0 + lVar22 + 6) = 0;
                    lVar22 = lVar22 + -1;
                  } while (1 < lVar22);
                }
                uStack_5f0 = 0x156a4b;
                pcVar24 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x20),
                                              (coda_dynamic_type *)0x0,
                                              (coda_product *)local_590._8_8_,&local_5e8);
                uStack_5f0 = 0x156a61;
                coda_mem_record_add_field
                          ((coda_mem_record *)local_590._16_8_,"run_by",(coda_dynamic_type *)pcVar24
                           ,0);
                local_5e8 = (char)uStack_410;
                cStack_5e7 = (char)((uint)uStack_410 >> 8);
                cStack_5e6 = (char)((uint)uStack_410 >> 0x10);
                cStack_5e5 = (char)((uint)uStack_410 >> 0x18);
                cStack_5e4 = (char)uStack_40c;
                cStack_5e3 = (char)((uint)uStack_40c >> 8);
                uStack_5e2 = (undefined1)((uint)uStack_40c >> 0x10);
                uStack_5e1 = uStack_40c._3_1_;
                uStack_5e0 = (undefined7)
                             (CONCAT44(uStack_405,
                                       CONCAT13(cStack_406,CONCAT21(uStack_408,uStack_40c._3_1_)))
                             >> 8);
                cStack_5d9 = '\0';
                uStack_5f0 = 0x156a8e;
                pcVar24 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x30),
                                              (coda_dynamic_type *)0x0,
                                              (coda_product *)local_590._8_8_,&local_5e8);
                uStack_5f0 = 0x156aa0;
                pcVar29 = coda_mem_time_new(*(coda_type_special **)(*plVar1 + 0x28),
                                            (coda_dynamic_type *)0x0,(coda_dynamic_type *)pcVar24);
                uStack_5f0 = 0x156ab6;
                coda_mem_record_add_field
                          ((coda_mem_record *)local_590._16_8_,"datetime",
                           (coda_dynamic_type *)pcVar29,0);
                local_5e8 = (char)local_400;
                cStack_5e7 = (char)((ushort)local_400 >> 8);
                cStack_5e6 = cStack_3fe;
                cStack_5e5 = 0;
                uStack_5f0 = 0x156ae3;
                pcVar24 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x38),
                                              (coda_dynamic_type *)0x0,
                                              (coda_product *)local_590._8_8_,&local_5e8);
                pcVar32 = "datetime_time_zone";
LAB_00156aef:
                uStack_5f0 = 0x156af9;
                coda_mem_record_add_field
                          ((coda_mem_record *)local_590._16_8_,pcVar32,(coda_dynamic_type *)pcVar24,
                           0);
              }
              else if (CONCAT13(cStack_3f6,CONCAT12(cStack_3f7,CONCAT11(cStack_3f8,cStack_3f9))) !=
                       0x544e454d ||
                       CONCAT13(cStack_3f9,CONCAT12(cStack_3fa,CONCAT11(cStack_3fb,local_3fc))) !=
                       0x4d4d4f43) {
                auVar57[0] = -(local_3fc == 'I');
                auVar57[1] = -(cStack_3fb == 'O');
                auVar57[2] = -(cStack_3fa == 'N');
                auVar57[3] = -(cStack_3f9 == 'O');
                auVar57[4] = -(cStack_3f8 == 'S');
                auVar57[5] = -(cStack_3f7 == 'P');
                auVar57[6] = -(cStack_3f6 == 'H');
                auVar57[7] = -(cStack_3f5 == 'E');
                auVar57[8] = -(cStack_3f4 == 'R');
                auVar57[9] = -(cStack_3f3 == 'I');
                auVar57[10] = -(cStack_3f2 == 'C');
                auVar57[0xb] = -(cStack_3f1 == ' ');
                auVar57[0xc] = -(cStack_3f0 == 'C');
                auVar57[0xd] = -(cStack_3ef == 'O');
                auVar57[0xe] = -(cStack_3ee == 'R');
                auVar57[0xf] = -(cStack_3ed == 'R');
                if ((ushort)((ushort)(SUB161(auVar57 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar57 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar57 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar57 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar57 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar57 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar57 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar57 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar57 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar57 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar57 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar57 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar57 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar57 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar57 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar57[0xf] >> 7) << 0xf) == 0xffff) {
                  uStack_5f0 = 0x156b10;
                  local_468 = coda_mem_record_new(*(coda_type_record **)(*plVar1 + 0x1c8),
                                                  (coda_dynamic_type *)0x0);
                  local_5e8 = (char)_local_438;
                  cStack_5e7 = (char)((uint)_local_438 >> 8);
                  cStack_5e6 = (char)((uint)_local_438 >> 0x10);
                  cStack_5e5 = (char)((uint)_local_438 >> 0x18);
                  cStack_5e4 = '\0';
                  uStack_5f0 = 0x156b2f;
                  sVar28 = strlen(&local_5e8);
                  if (0 < (long)sVar28) {
                    lVar22 = sVar28 + 1;
                    do {
                      if (*(char *)((long)&uStack_5f0 + lVar22 + 6) != ' ') break;
                      *(undefined1 *)((long)&uStack_5f0 + lVar22 + 6) = 0;
                      lVar22 = lVar22 + -1;
                    } while (1 < lVar22);
                  }
                  bVar35 = false;
                  uStack_5f0 = 0x156b69;
                  pcVar24 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x1b0),
                                                (coda_dynamic_type *)0x0,
                                                (coda_product *)local_590._8_8_,&local_5e8);
                  uStack_5f0 = 0x156b82;
                  coda_mem_record_add_field(local_468,"type",(coda_dynamic_type *)pcVar24,0);
                  uStack_5f0 = 0x156b94;
                  pcVar27 = coda_mem_array_new(*(coda_type_array **)(*plVar1 + 0x1c0),
                                               (coda_dynamic_type *)0x0);
                  uStack_5f0 = 0x156bb0;
                  lVar22 = coda_ascii_parse_double(acStack_433,0xc,(double *)&local_5a0,0);
                  if (-1 < lVar22) {
                    pcVar32 = (char *)((long)&local_428 + 1);
                    uVar34 = 0xffffffffffffffff;
                    do {
                      index = uVar34 + 1;
                      uStack_5f0 = 0x156be5;
                      pcVar24 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x1b8),
                                                    (coda_dynamic_type *)0x0,
                                                    (coda_product *)local_590._8_8_,
                                                    (double)CONCAT44(uStack_59c,local_5a0));
                      uStack_5f0 = 0x156bf3;
                      coda_mem_array_set_element(pcVar27,index,(coda_dynamic_type *)pcVar24);
                      pcVar31 = local_468;
                      if (uVar34 == 2) {
                        bVar35 = true;
                        uStack_5f0 = 0x156f4d;
                        coda_mem_record_add_field
                                  (local_468,"parameter",(coda_dynamic_type *)pcVar27,0);
                        uStack_5f0 = 0x156f5d;
                        coda_mem_array_add_element
                                  ((coda_mem_array *)local_478._0_8_,(coda_dynamic_type *)pcVar31);
                        goto LAB_00156f68;
                      }
                      uStack_5f0 = 0x156c11;
                      lVar22 = coda_ascii_parse_double(pcVar32,0xc,(double *)&local_5a0,0);
                      pcVar32 = pcVar32 + 0xc;
                      uVar34 = index;
                    } while (-1 < lVar22);
                    bVar35 = 2 < index;
                  }
                  uStack_5f0 = 0x156c38;
                  coda_dynamic_type_delete((coda_dynamic_type *)pcVar27);
                  uStack_5f0 = 0x156c45;
                  coda_dynamic_type_delete((coda_dynamic_type *)local_468);
                  uStack_5f0 = 0x156c63;
                  coda_add_error_message
                            (" (line: %ld, byte offset: %ld)",local_4a8._0_8_,local_4a8._8_8_);
LAB_00156f68:
                  if (!bVar35) break;
                }
                else {
                  auVar58[0] = -(local_3fc == 'T');
                  auVar58[1] = -(cStack_3fb == 'I');
                  auVar58[2] = -(cStack_3fa == 'M');
                  auVar58[3] = -(cStack_3f9 == 'E');
                  auVar58[4] = -(cStack_3f8 == ' ');
                  auVar58[5] = -(cStack_3f7 == 'S');
                  auVar58[6] = -(cStack_3f6 == 'Y');
                  auVar58[7] = -(cStack_3f5 == 'S');
                  auVar58[8] = -(cStack_3f4 == 'T');
                  auVar58[9] = -(cStack_3f3 == 'E');
                  auVar58[10] = -(cStack_3f2 == 'M');
                  auVar58[0xb] = -(cStack_3f1 == ' ');
                  auVar58[0xc] = -(cStack_3f0 == 'C');
                  auVar58[0xd] = -(cStack_3ef == 'O');
                  auVar58[0xe] = -(cStack_3ee == 'R');
                  auVar58[0xf] = -(cStack_3ed == 'R');
                  if ((ushort)((ushort)(SUB161(auVar58 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar58 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar58 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar58 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar58 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar58 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar58 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar58 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar58 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar58 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar58 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar58 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar58 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar58 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar58 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar58[0xf] >> 7) << 0xf) != 0xffff) {
                    if (CONCAT13(cStack_3f1,CONCAT12(cStack_3f2,CONCAT11(cStack_3f3,cStack_3f4))) ==
                        0x53444e4f &&
                        CONCAT17(cStack_3f5,
                                 CONCAT16(cStack_3f6,
                                          CONCAT15(cStack_3f7,
                                                   CONCAT14(cStack_3f8,
                                                            CONCAT13(cStack_3f9,
                                                                     CONCAT12(cStack_3fa,
                                                                              CONCAT11(cStack_3fb,
                                                                                       local_3fc))))
                                                  ))) == 0x434553205041454c) {
                      uStack_5f0 = 0x15695b;
                      lVar23 = coda_ascii_parse_int64(local_438,6,(int64_t *)local_598,0);
                      lVar22 = local_4a8._8_8_;
                      if (-1 < lVar23) {
                        uStack_5f0 = 0x15697f;
                        pcVar24 = coda_mem_int32_new(*(coda_type_number **)(*plVar1 + 0x148),
                                                     (coda_dynamic_type *)0x0,
                                                     (coda_product *)local_590._8_8_,local_598[0]);
                        pcVar32 = "leap_seconds";
                        goto LAB_00156aef;
                      }
                      goto LAB_0015768f;
                    }
                    if (CONCAT17(cStack_3f0,
                                 CONCAT16(cStack_3f1,
                                          CONCAT15(cStack_3f2,
                                                   CONCAT14(cStack_3f3,
                                                            CONCAT13(cStack_3f4,
                                                                     CONCAT12(cStack_3f5,
                                                                              CONCAT11(cStack_3f6,
                                                                                       cStack_3f7)))
                                                           )))) == 0x5245444145482046 &&
                        CONCAT17(cStack_3f5,
                                 CONCAT16(cStack_3f6,
                                          CONCAT15(cStack_3f7,
                                                   CONCAT14(cStack_3f8,
                                                            CONCAT13(cStack_3f9,
                                                                     CONCAT12(cStack_3fa,
                                                                              CONCAT11(cStack_3fb,
                                                                                       local_3fc))))
                                                  ))) == 0x4820464f20444e45) goto LAB_001576fa;
                    message = "invalid header item \'%s\' (line: %ld, byte offset: %ld)";
                    lVar22 = local_4a8._8_8_ + 0x3c;
                    goto LAB_0015521f;
                  }
                  uStack_5f0 = 0x156c7a;
                  pcVar31 = coda_mem_record_new(*(coda_type_record **)(*plVar1 + 0x210),
                                                (coda_dynamic_type *)0x0);
                  local_5e8 = (char)_local_438;
                  cStack_5e7 = (char)((uint)_local_438 >> 8);
                  cStack_5e6 = (char)((uint)_local_438 >> 0x10);
                  cStack_5e5 = (char)((uint)_local_438 >> 0x18);
                  cStack_5e4 = '\0';
                  uStack_5f0 = 0x156c94;
                  sVar28 = strlen(&local_5e8);
                  if (0 < (long)sVar28) {
                    lVar22 = sVar28 + 1;
                    do {
                      if (*(char *)((long)&uStack_5f0 + lVar22 + 6) != ' ') break;
                      *(undefined1 *)((long)&uStack_5f0 + lVar22 + 6) = 0;
                      lVar22 = lVar22 + -1;
                    } while (1 < lVar22);
                  }
                  uStack_5f0 = 0x156ccb;
                  pcVar24 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x1d8),
                                                (coda_dynamic_type *)0x0,
                                                (coda_product *)local_590._8_8_,&local_5e8);
                  uStack_5f0 = 0x156cdf;
                  coda_mem_record_add_field(pcVar31,"type",(coda_dynamic_type *)pcVar24,0);
                  bVar35 = cStack_5e7 == 'B';
                  bVar4 = local_5e8 == 'S';
                  uStack_5f0 = 0x156d0d;
                  lVar22 = coda_ascii_parse_double(acStack_433,0x11,(double *)&local_5a0,0);
                  if (lVar22 < 0) {
                    uStack_5f0 = 0x157897;
                    coda_dynamic_type_delete((coda_dynamic_type *)pcVar31);
                    lVar22 = local_4a8._8_8_ + 5;
                    goto LAB_0015768f;
                  }
                  uStack_5f0 = 0x156d33;
                  pcVar24 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x1e0),
                                                (coda_dynamic_type *)0x0,
                                                (coda_product *)local_590._8_8_,
                                                (double)CONCAT44(uStack_59c,local_5a0));
                  uStack_5f0 = 0x156d47;
                  coda_mem_record_add_field(pcVar31,"a0",(coda_dynamic_type *)pcVar24,0);
                  uStack_5f0 = 0x156d5e;
                  lVar22 = coda_ascii_parse_double
                                     ((char *)((long)&uStack_424 + 2),0x10,(double *)&local_5a0,0);
                  if (lVar22 < 0) {
                    uStack_5f0 = 0x1578b8;
                    coda_dynamic_type_delete((coda_dynamic_type *)pcVar31);
                    lVar22 = local_4a8._8_8_ + 0x16;
                    goto LAB_0015768f;
                  }
                  uStack_5f0 = 0x156d84;
                  pcVar24 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x1e8),
                                                (coda_dynamic_type *)0x0,
                                                (coda_product *)local_590._8_8_,
                                                (double)CONCAT44(uStack_59c,local_5a0));
                  uStack_5f0 = 0x156d98;
                  coda_mem_record_add_field(pcVar31,"a1",(coda_dynamic_type *)pcVar24,0);
                  uStack_5f0 = 0x156db4;
                  lVar22 = coda_ascii_parse_int64
                                     ((char *)((long)&uStack_414 + 2),7,(int64_t *)local_598,0);
                  if (lVar22 < 0) {
                    uStack_5f0 = 0x1578d9;
                    coda_dynamic_type_delete((coda_dynamic_type *)pcVar31);
                    lVar22 = local_4a8._8_8_ + 0x26;
                    goto LAB_0015768f;
                  }
                  uStack_5f0 = 0x156dd8;
                  pcVar24 = coda_mem_int32_new(*(coda_type_number **)(*plVar1 + 0x1f0),
                                               (coda_dynamic_type *)0x0,
                                               (coda_product *)local_590._8_8_,local_598[0]);
                  uStack_5f0 = 0x156dec;
                  coda_mem_record_add_field(pcVar31,"T",(coda_dynamic_type *)pcVar24,0);
                  uStack_5f0 = 0x156e03;
                  lVar22 = coda_ascii_parse_int64
                                     ((char *)((long)&uStack_40c + 1),5,(int64_t *)local_598,0);
                  if (lVar22 < 0) {
                    uStack_5f0 = 0x1578fa;
                    coda_dynamic_type_delete((coda_dynamic_type *)pcVar31);
                    lVar22 = local_4a8._8_8_ + 0x2d;
                    goto LAB_0015768f;
                  }
                  uStack_5f0 = 0x156e28;
                  pcVar24 = coda_mem_int16_new(*(coda_type_number **)(*plVar1 + 0x1f8),
                                               (coda_dynamic_type *)0x0,
                                               (coda_product *)local_590._8_8_,
                                               (uint16_t)local_598[0]);
                  uStack_5f0 = 0x156e3c;
                  coda_mem_record_add_field(pcVar31,"W",(coda_dynamic_type *)pcVar24,0);
                  if (bVar35 && bVar4) {
                    cStack_5e4 = cStack_401;
                    local_5e8 = (char)uStack_405;
                    cStack_5e7 = (char)((uint)uStack_405 >> 8);
                    cStack_5e6 = (char)((uint)uStack_405 >> 0x10);
                    cStack_5e5 = (char)((uint)uStack_405 >> 0x18);
                    cStack_5e3 = '\0';
                    uStack_5f0 = 0x156e6e;
                    sVar28 = strlen(&local_5e8);
                    if (0 < (long)sVar28) {
                      lVar22 = sVar28 + 1;
                      do {
                        if (*(char *)((long)&uStack_5f0 + lVar22 + 6) != ' ') break;
                        *(undefined1 *)((long)&uStack_5f0 + lVar22 + 6) = 0;
                        lVar22 = lVar22 + -1;
                      } while (1 < lVar22);
                    }
                    uStack_5f0 = 0x156ea5;
                    pcVar24 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x200),
                                                  (coda_dynamic_type *)0x0,
                                                  (coda_product *)local_590._8_8_,&local_5e8);
                    uStack_5f0 = 0x156eb9;
                    coda_mem_record_add_field(pcVar31,"S",(coda_dynamic_type *)pcVar24,0);
                    uStack_5f0 = 0x156ed0;
                    lVar22 = coda_ascii_parse_int64
                                       ((char *)((long)&local_400 + 1),2,(int64_t *)local_598,0);
                    if (lVar22 < 0) {
                      uStack_5f0 = 0x15791b;
                      coda_dynamic_type_delete((coda_dynamic_type *)pcVar31);
                      lVar22 = local_4a8._8_8_ + 0x39;
                      goto LAB_0015768f;
                    }
                    uStack_5f0 = 0x156ef5;
                    pcVar24 = coda_mem_uint8_new(*(coda_type_number **)(*plVar1 + 0x208),
                                                 (coda_dynamic_type *)0x0,
                                                 (coda_product *)local_590._8_8_,
                                                 (uint8_t)local_598[0]);
                    uStack_5f0 = 0x156f09;
                    coda_mem_record_add_field(pcVar31,"U",(coda_dynamic_type *)pcVar24,0);
                  }
                  uStack_5f0 = 0x156f19;
                  coda_mem_array_add_element
                            ((coda_mem_array *)local_478._8_8_,(coda_dynamic_type *)pcVar31);
                }
              }
              uStack_5f0 = 0x156f85;
              local_4a8._8_8_ = ftell((FILE *)local_590._0_8_);
              local_4a8._0_8_ = local_4a8._0_8_ + 1;
              uStack_5f0 = 0x156fa7;
              uVar21 = get_line((FILE *)local_590._0_8_,local_438);
            } while (-1 < (int)uVar21);
          }
          goto LAB_00155226;
        }
        if (local_4b0 != 'O') {
          uStack_5f0 = 0x156fc9;
          pcVar27 = coda_mem_array_new(*(coda_type_array **)(*(long *)(lVar23 + 0x1118) + 0x100),
                                       (coda_dynamic_type *)0x0);
          local_488 = (undefined1  [8])pcVar27;
          uStack_5f0 = 0x156fdb;
          local_4a8._8_8_ = ftell((FILE *)local_590._0_8_);
          local_4a8._0_8_ = local_4a8._0_8_ + 1;
          uStack_5f0 = 0x156ffd;
          uVar21 = get_line((FILE *)local_590._0_8_,local_438);
          if (-1 < (int)uVar21) {
            plVar1 = (long *)(lVar23 + 0x1118);
            local_448 = 0x5552202f204d4750;
            uStack_440 = 0x44202f205942204e;
            local_458 = 0x42204e5552202f20;
            uStack_450 = 0x45544144202f2059;
            local_468 = (coda_mem_record *)0x2023202f20535953;
            uStack_460 = 0x59542053424f202f;
            local_48 = 0x4f202f2023202f20;
            uStack_40 = 0x5345505954205342;
            do {
              if (uVar21 == 0) {
LAB_001579df:
                uStack_5f0 = 0x1579fa;
                coda_mem_record_add_field
                          ((coda_mem_record *)local_590._16_8_,"sys",(coda_dynamic_type *)local_488,
                           0);
                auVar6._8_8_ = 0;
                auVar6._0_8_ = pcStack_480;
                _local_488 = auVar6 << 0x40;
                uStack_5f0 = 0x157a10;
                local_4a8._8_8_ = ftell((FILE *)local_590._0_8_);
                local_4a8._0_8_ = local_4a8._0_8_ + 1;
                uStack_5f0 = 0x157a2a;
                iVar20 = coda_mem_record_validate((coda_mem_record *)local_590._16_8_);
                if (iVar20 == 0) {
                  uStack_5f0 = 0x157a3c;
                  pcVar30 = coda_type_array_new(coda_format_rinex);
                  uStack_5f0 = 0x157a49;
                  coda_type_array_add_variable_dimension(pcVar30,(coda_expression *)0x0);
                  uStack_5f0 = 0x157a5c;
                  coda_type_array_set_base_type(pcVar30,*(coda_type **)(*plVar1 + 0x478));
                  uStack_5f0 = 0x157a66;
                  pcVar27 = coda_mem_array_new(pcVar30,(coda_dynamic_type *)0x0);
                  pcStack_480 = pcVar27;
                  uStack_5f0 = 0x157a7a;
                  coda_type_release((coda_type *)pcVar30);
                  uStack_5f0 = 0x157a82;
                  iVar20 = read_clock_records((ingest_info *)local_590);
                  goto LAB_00157b53;
                }
                break;
              }
              if (uVar21 < 0x3d) goto LAB_001576a2;
              auVar59[0] = -(local_3fc == (char)local_448);
              auVar59[1] = -(cStack_3fb == local_448._1_1_);
              auVar59[2] = -(cStack_3fa == local_448._2_1_);
              auVar59[3] = -(cStack_3f9 == local_448._3_1_);
              auVar59[4] = -(cStack_3f8 == local_448._4_1_);
              auVar59[5] = -(cStack_3f7 == local_448._5_1_);
              auVar59[6] = -(cStack_3f6 == local_448._6_1_);
              auVar59[7] = -(cStack_3f5 == local_448._7_1_);
              auVar59[8] = -(cStack_3f4 == (char)uStack_440);
              auVar59[9] = -(cStack_3f3 == uStack_440._1_1_);
              auVar59[10] = -(cStack_3f2 == uStack_440._2_1_);
              auVar59[0xb] = -(cStack_3f1 == uStack_440._3_1_);
              auVar59[0xc] = -(cStack_3f0 == uStack_440._4_1_);
              auVar59[0xd] = -(cStack_3ef == uStack_440._5_1_);
              auVar59[0xe] = -(cStack_3ee == uStack_440._6_1_);
              auVar59[0xf] = -(cStack_3ed == uStack_440._7_1_);
              auVar88[0] = -(cStack_3f9 == (char)local_458);
              auVar88[1] = -(cStack_3f8 == local_458._1_1_);
              auVar88[2] = -(cStack_3f7 == local_458._2_1_);
              auVar88[3] = -(cStack_3f6 == local_458._3_1_);
              auVar88[4] = -(cStack_3f5 == local_458._4_1_);
              auVar88[5] = -(cStack_3f4 == local_458._5_1_);
              auVar88[6] = -(cStack_3f3 == local_458._6_1_);
              auVar88[7] = -(cStack_3f2 == local_458._7_1_);
              auVar88[8] = -(cStack_3f1 == (char)uStack_450);
              auVar88[9] = -(cStack_3f0 == uStack_450._1_1_);
              auVar88[10] = -(cStack_3ef == uStack_450._2_1_);
              auVar88[0xb] = -(cStack_3ee == uStack_450._3_1_);
              auVar88[0xc] = -(cStack_3ed == uStack_450._4_1_);
              auVar88[0xd] = -(local_3ec == uStack_450._5_1_);
              auVar88[0xe] = -(cStack_3eb == uStack_450._6_1_);
              auVar88[0xf] = -(cStack_3ea == uStack_450._7_1_);
              auVar88 = auVar88 & auVar59;
              if ((ushort)((ushort)(SUB161(auVar88 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar88 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar88 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar88 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar88 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar88 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar88 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar88 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar88 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar88 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar88 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar88 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar88 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar88 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar88 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar88[0xf] >> 7) << 0xf) == 0xffff) {
                local_5e8 = (char)_local_438;
                cStack_5e7 = (char)((uint)_local_438 >> 8);
                cStack_5e6 = (char)((uint)_local_438 >> 0x10);
                uStack_5e2 = (undefined1)acStack_433._1_2_;
                uStack_5e1 = SUB21(acStack_433._1_2_,1);
                uStack_5e0 = (undefined7)stack0xfffffffffffffbd0;
                cStack_5d9 = (char)((ulong)stack0xfffffffffffffbd0 >> 0x38);
                local_5d8 = (uint5)local_428;
                uStack_5f0 = 0x157442;
                cStack_5e5 = cStack_435;
                sVar28 = strlen(&local_5e8);
                if (0 < (long)sVar28) {
                  lVar22 = sVar28 + 1;
                  do {
                    if (*(char *)((long)&uStack_5f0 + lVar22 + 6) != ' ') break;
                    *(undefined1 *)((long)&uStack_5f0 + lVar22 + 6) = 0;
                    lVar22 = lVar22 + -1;
                  } while (1 < lVar22);
                }
                uStack_5f0 = 0x157476;
                pcVar24 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x18),
                                              (coda_dynamic_type *)0x0,
                                              (coda_product *)local_590._8_8_,&local_5e8);
                uStack_5f0 = 0x15748c;
                coda_mem_record_add_field
                          ((coda_mem_record *)local_590._16_8_,"program",
                           (coda_dynamic_type *)pcVar24,0);
                local_5e8 = (char)uStack_424;
                cStack_5e7 = (char)(uStack_424 >> 8);
                cStack_5e6 = (char)(uStack_424 >> 0x10);
                cStack_5e5 = (char)(uStack_424 >> 0x18);
                cStack_5e4 = (char)uStack_420;
                cStack_5e3 = (char)((uint)uStack_420 >> 8);
                uStack_5e2 = (undefined1)((uint)uStack_420 >> 0x10);
                uStack_5e1 = (undefined1)((uint)uStack_420 >> 0x18);
                uStack_5e0 = (undefined7)CONCAT44(uStack_418,uStack_41c);
                cStack_5d9 = (char)((uint)uStack_418 >> 0x18);
                _local_5d8 = CONCAT44(stack0xfffffffffffffa2c,uStack_414);
                uStack_5f0 = 0x1574a7;
                sVar28 = strlen(&local_5e8);
                if (0 < (long)sVar28) {
                  lVar22 = sVar28 + 1;
                  do {
                    if (*(char *)((long)&uStack_5f0 + lVar22 + 6) != ' ') break;
                    *(undefined1 *)((long)&uStack_5f0 + lVar22 + 6) = 0;
                    lVar22 = lVar22 + -1;
                  } while (1 < lVar22);
                }
                uStack_5f0 = 0x1574db;
                pcVar24 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x20),
                                              (coda_dynamic_type *)0x0,
                                              (coda_product *)local_590._8_8_,&local_5e8);
                uStack_5f0 = 0x1574f1;
                coda_mem_record_add_field
                          ((coda_mem_record *)local_590._16_8_,"run_by",(coda_dynamic_type *)pcVar24
                           ,0);
                local_5e8 = (char)uStack_410;
                cStack_5e7 = (char)((uint)uStack_410 >> 8);
                cStack_5e6 = (char)((uint)uStack_410 >> 0x10);
                cStack_5e5 = (char)((uint)uStack_410 >> 0x18);
                cStack_5e4 = (char)uStack_40c;
                cStack_5e3 = (char)((uint)uStack_40c >> 8);
                uStack_5e2 = (undefined1)((uint)uStack_40c >> 0x10);
                uStack_5e1 = uStack_40c._3_1_;
                uStack_5e0 = (undefined7)
                             (CONCAT44(uStack_405,
                                       CONCAT13(cStack_406,CONCAT21(uStack_408,uStack_40c._3_1_)))
                             >> 8);
                cStack_5d9 = '\0';
                uStack_5f0 = 0x15751e;
                pcVar24 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x30),
                                              (coda_dynamic_type *)0x0,
                                              (coda_product *)local_590._8_8_,&local_5e8);
                uStack_5f0 = 0x157530;
                pcVar29 = coda_mem_time_new(*(coda_type_special **)(*plVar1 + 0x28),
                                            (coda_dynamic_type *)0x0,(coda_dynamic_type *)pcVar24);
                uStack_5f0 = 0x157546;
                coda_mem_record_add_field
                          ((coda_mem_record *)local_590._16_8_,"datetime",
                           (coda_dynamic_type *)pcVar29,0);
                local_5e8 = (char)local_400;
                cStack_5e7 = (char)((ushort)local_400 >> 8);
                cStack_5e6 = cStack_3fe;
                cStack_5e5 = 0;
                uStack_5f0 = 0x157573;
                pcVar24 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x38),
                                              (coda_dynamic_type *)0x0,
                                              (coda_product *)local_590._8_8_,&local_5e8);
                pcVar32 = "datetime_time_zone";
                goto LAB_0015757f;
              }
              if (CONCAT13(cStack_3f6,CONCAT12(cStack_3f7,CONCAT11(cStack_3f8,cStack_3f9))) !=
                  0x544e454d ||
                  CONCAT13(cStack_3f9,CONCAT12(cStack_3fa,CONCAT11(cStack_3fb,local_3fc))) !=
                  0x4d4d4f43) {
                auVar60[0] = -(local_3fc == (char)local_468);
                auVar60[1] = -(cStack_3fb == local_468._1_1_);
                auVar60[2] = -(cStack_3fa == local_468._2_1_);
                auVar60[3] = -(cStack_3f9 == local_468._3_1_);
                auVar60[4] = -(cStack_3f8 == local_468._4_1_);
                auVar60[5] = -(cStack_3f7 == local_468._5_1_);
                auVar60[6] = -(cStack_3f6 == local_468._6_1_);
                auVar60[7] = -(cStack_3f5 == local_468._7_1_);
                auVar60[8] = -(cStack_3f4 == (char)uStack_460);
                auVar60[9] = -(cStack_3f3 == uStack_460._1_1_);
                auVar60[10] = -(cStack_3f2 == uStack_460._2_1_);
                auVar60[0xb] = -(cStack_3f1 == uStack_460._3_1_);
                auVar60[0xc] = -(cStack_3f0 == uStack_460._4_1_);
                auVar60[0xd] = -(cStack_3ef == uStack_460._5_1_);
                auVar60[0xe] = -(cStack_3ee == uStack_460._6_1_);
                auVar60[0xf] = -(cStack_3ed == uStack_460._7_1_);
                auVar89[0] = -(cStack_3f9 == (char)local_48);
                auVar89[1] = -(cStack_3f8 == local_48._1_1_);
                auVar89[2] = -(cStack_3f7 == local_48._2_1_);
                auVar89[3] = -(cStack_3f6 == local_48._3_1_);
                auVar89[4] = -(cStack_3f5 == local_48._4_1_);
                auVar89[5] = -(cStack_3f4 == local_48._5_1_);
                auVar89[6] = -(cStack_3f3 == local_48._6_1_);
                auVar89[7] = -(cStack_3f2 == local_48._7_1_);
                auVar89[8] = -(cStack_3f1 == (char)uStack_40);
                auVar89[9] = -(cStack_3f0 == uStack_40._1_1_);
                auVar89[10] = -(cStack_3ef == uStack_40._2_1_);
                auVar89[0xb] = -(cStack_3ee == uStack_40._3_1_);
                auVar89[0xc] = -(cStack_3ed == uStack_40._4_1_);
                auVar89[0xd] = -(local_3ec == uStack_40._5_1_);
                auVar89[0xe] = -(cStack_3eb == uStack_40._6_1_);
                auVar89[0xf] = -(cStack_3ea == uStack_40._7_1_);
                auVar89 = auVar89 & auVar60;
                if ((ushort)((ushort)(SUB161(auVar89 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar89 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar89 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar89 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar89 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar89 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar89 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar89 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar89 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar89 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar89 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar89 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar89 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar89 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar89 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar89[0xf] >> 7) << 0xf) == 0xffff) {
                  uStack_5f0 = 0x157598;
                  iVar20 = handle_observation_definition((ingest_info *)local_590,local_438);
                  if (iVar20 != 0) break;
                }
                else {
                  if (CONCAT17(cStack_3ef,
                               CONCAT16(cStack_3f0,
                                        CONCAT15(cStack_3f1,
                                                 CONCAT14(cStack_3f2,
                                                          CONCAT13(cStack_3f3,
                                                                   CONCAT12(cStack_3f4,
                                                                            CONCAT11(cStack_3f5,
                                                                                     cStack_3f6)))))
                                       )) == 0x4449204d45545359 &&
                      CONCAT17(cStack_3f5,
                               CONCAT16(cStack_3f6,
                                        CONCAT15(cStack_3f7,
                                                 CONCAT14(cStack_3f8,
                                                          CONCAT13(cStack_3f9,
                                                                   CONCAT12(cStack_3fa,
                                                                            CONCAT11(cStack_3fb,
                                                                                     local_3fc))))))
                              ) == 0x53595320454d4954) {
                    cStack_5e6 = acStack_433[0];
                    local_5e8 = cStack_435;
                    cStack_5e7 = cStack_434;
                    cStack_5e5 = 0;
                    uStack_5f0 = 0x1575f2;
                    sVar28 = strlen(&local_5e8);
                    if (0 < (long)sVar28) {
                      lVar22 = sVar28 + 1;
                      do {
                        if (*(char *)((long)&uStack_5f0 + lVar22 + 6) != ' ') break;
                        *(undefined1 *)((long)&uStack_5f0 + lVar22 + 6) = 0;
                        lVar22 = lVar22 + -1;
                      } while (1 < lVar22);
                    }
                    uStack_5f0 = 0x157629;
                    pcVar24 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x158),
                                                  (coda_dynamic_type *)0x0,
                                                  (coda_product *)local_590._8_8_,&local_5e8);
                    pcVar32 = "time_system_id";
                  }
                  else {
                    if (CONCAT13(cStack_3f1,CONCAT12(cStack_3f2,CONCAT11(cStack_3f3,cStack_3f4))) !=
                        0x53444e4f ||
                        CONCAT17(cStack_3f5,
                                 CONCAT16(cStack_3f6,
                                          CONCAT15(cStack_3f7,
                                                   CONCAT14(cStack_3f8,
                                                            CONCAT13(cStack_3f9,
                                                                     CONCAT12(cStack_3fa,
                                                                              CONCAT11(cStack_3fb,
                                                                                       local_3fc))))
                                                  ))) != 0x434553205041454c) {
                      auVar61[0] = -(local_3fc == 'S');
                      auVar61[1] = -(cStack_3fb == 'Y');
                      auVar61[2] = -(cStack_3fa == 'S');
                      auVar61[3] = -(cStack_3f9 == ' ');
                      auVar61[4] = -(cStack_3f8 == '/');
                      auVar61[5] = -(cStack_3f7 == ' ');
                      auVar61[6] = -(cStack_3f6 == 'D');
                      auVar61[7] = -(cStack_3f5 == 'C');
                      auVar61[8] = -(cStack_3f4 == 'B');
                      auVar61[9] = -(cStack_3f3 == 'S');
                      auVar61[10] = -(cStack_3f2 == ' ');
                      auVar61[0xb] = -(cStack_3f1 == 'A');
                      auVar61[0xc] = -(cStack_3f0 == 'P');
                      auVar61[0xd] = -(cStack_3ef == 'P');
                      auVar61[0xe] = -(cStack_3ee == 'L');
                      auVar61[0xf] = -(cStack_3ed == 'I');
                      auVar90[0] = -(local_3ec == 'E');
                      auVar90[1] = -(cStack_3eb == 'D');
                      auVar90[2] = 0xff;
                      auVar90[3] = 0xff;
                      auVar90[4] = 0xff;
                      auVar90[5] = 0xff;
                      auVar90[6] = 0xff;
                      auVar90[7] = 0xff;
                      auVar90[8] = 0xff;
                      auVar90[9] = 0xff;
                      auVar90[10] = 0xff;
                      auVar90[0xb] = 0xff;
                      auVar90[0xc] = 0xff;
                      auVar90[0xd] = 0xff;
                      auVar90[0xe] = 0xff;
                      auVar90[0xf] = 0xff;
                      auVar90 = auVar90 & auVar61;
                      if ((((((ushort)((ushort)(SUB161(auVar90 >> 7,0) & 1) |
                                       (ushort)(SUB161(auVar90 >> 0xf,0) & 1) << 1 |
                                       (ushort)(SUB161(auVar90 >> 0x17,0) & 1) << 2 |
                                       (ushort)(SUB161(auVar90 >> 0x1f,0) & 1) << 3 |
                                       (ushort)(SUB161(auVar90 >> 0x27,0) & 1) << 4 |
                                       (ushort)(SUB161(auVar90 >> 0x2f,0) & 1) << 5 |
                                       (ushort)(SUB161(auVar90 >> 0x37,0) & 1) << 6 |
                                       (ushort)(SUB161(auVar90 >> 0x3f,0) & 1) << 7 |
                                       (ushort)(SUB161(auVar90 >> 0x47,0) & 1) << 8 |
                                       (ushort)(SUB161(auVar90 >> 0x4f,0) & 1) << 9 |
                                       (ushort)(SUB161(auVar90 >> 0x57,0) & 1) << 10 |
                                       (ushort)(SUB161(auVar90 >> 0x5f,0) & 1) << 0xb |
                                       (ushort)(SUB161(auVar90 >> 0x67,0) & 1) << 0xc |
                                       (ushort)(SUB161(auVar90 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar90 >> 0x77,0) & 1) << 0xe |
                                      (ushort)(byte)(auVar90[0xf] >> 7) << 0xf) == 0xffff) ||
                            (auVar62[0] = -(local_3fc == 'S'), auVar62[1] = -(cStack_3fb == 'Y'),
                            auVar62[2] = -(cStack_3fa == 'S'), auVar62[3] = -(cStack_3f9 == ' '),
                            auVar62[4] = -(cStack_3f8 == '/'), auVar62[5] = -(cStack_3f7 == ' '),
                            auVar62[6] = -(cStack_3f6 == 'P'), auVar62[7] = -(cStack_3f5 == 'C'),
                            auVar62[8] = -(cStack_3f4 == 'V'), auVar62[9] = -(cStack_3f3 == 'S'),
                            auVar62[10] = -(cStack_3f2 == ' '), auVar62[0xb] = -(cStack_3f1 == 'A'),
                            auVar62[0xc] = -(cStack_3f0 == 'P'), auVar62[0xd] = -(cStack_3ef == 'P')
                            , auVar62[0xe] = -(cStack_3ee == 'L'),
                            auVar62[0xf] = -(cStack_3ed == 'I'), auVar91[0] = -(local_3ec == 'E'),
                            auVar91[1] = -(cStack_3eb == 'D'), auVar91[2] = 0xff, auVar91[3] = 0xff,
                            auVar91[4] = 0xff, auVar91[5] = 0xff, auVar91[6] = 0xff,
                            auVar91[7] = 0xff, auVar91[8] = 0xff, auVar91[9] = 0xff,
                            auVar91[10] = 0xff, auVar91[0xb] = 0xff, auVar91[0xc] = 0xff,
                            auVar91[0xd] = 0xff, auVar91[0xe] = 0xff, auVar91[0xf] = 0xff,
                            auVar91 = auVar91 & auVar62,
                            (ushort)((ushort)(SUB161(auVar91 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar91 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar91 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar91 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar91 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar91 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar91 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar91 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar91 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar91 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar91 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar91 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar91 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar91 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar91 >> 0x77,0) & 1) << 0xe |
                                    (ushort)(byte)(auVar91[0xf] >> 7) << 0xf) == 0xffff)) ||
                           (auVar63[0] = -(local_3fc == '#'), auVar63[1] = -(cStack_3fb == ' '),
                           auVar63[2] = -(cStack_3fa == '/'), auVar63[3] = -(cStack_3f9 == ' '),
                           auVar63[4] = -(cStack_3f8 == 'T'), auVar63[5] = -(cStack_3f7 == 'Y'),
                           auVar63[6] = -(cStack_3f6 == 'P'), auVar63[7] = -(cStack_3f5 == 'E'),
                           auVar63[8] = -(cStack_3f4 == 'S'), auVar63[9] = -(cStack_3f3 == ' '),
                           auVar63[10] = -(cStack_3f2 == 'O'), auVar63[0xb] = -(cStack_3f1 == 'F'),
                           auVar63[0xc] = -(cStack_3f0 == ' '), auVar63[0xd] = -(cStack_3ef == 'D'),
                           auVar63[0xe] = -(cStack_3ee == 'A'), auVar63[0xf] = -(cStack_3ed == 'T'),
                           auVar92[0] = -(local_3ec == 'A'), auVar92[1] = 0xff, auVar92[2] = 0xff,
                           auVar92[3] = 0xff, auVar92[4] = 0xff, auVar92[5] = 0xff,
                           auVar92[6] = 0xff, auVar92[7] = 0xff, auVar92[8] = 0xff,
                           auVar92[9] = 0xff, auVar92[10] = 0xff, auVar92[0xb] = 0xff,
                           auVar92[0xc] = 0xff, auVar92[0xd] = 0xff, auVar92[0xe] = 0xff,
                           auVar92[0xf] = 0xff, auVar92 = auVar92 & auVar63,
                           (ushort)((ushort)(SUB161(auVar92 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar92 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar92 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar92 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar92 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar92 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar92 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar92 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar92 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar92 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar92 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar92 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar92 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar92 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)(SUB161(auVar92 >> 0x77,0) & 1) << 0xe |
                                   (ushort)(byte)(auVar92[0xf] >> 7) << 0xf) == 0xffff)) ||
                          (((auVar64[0] = -(local_3fc == 'S'), auVar64[1] = -(cStack_3fb == 'T'),
                            auVar64[2] = -(cStack_3fa == 'A'), auVar64[3] = -(cStack_3f9 == 'T'),
                            auVar64[4] = -(cStack_3f8 == 'I'), auVar64[5] = -(cStack_3f7 == 'O'),
                            auVar64[6] = -(cStack_3f6 == 'N'), auVar64[7] = -(cStack_3f5 == ' '),
                            auVar64[8] = -(cStack_3f4 == 'N'), auVar64[9] = -(cStack_3f3 == 'A'),
                            auVar64[10] = -(cStack_3f2 == 'M'), auVar64[0xb] = -(cStack_3f1 == 'E'),
                            auVar64[0xc] = -(cStack_3f0 == ' '), auVar64[0xd] = -(cStack_3ef == '/')
                            , auVar64[0xe] = -(cStack_3ee == ' '),
                            auVar64[0xf] = -(cStack_3ed == 'N'), auVar93[0] = -(local_3ec == 'U'),
                            auVar93[1] = -(cStack_3eb == 'M'), auVar93[2] = 0xff, auVar93[3] = 0xff,
                            auVar93[4] = 0xff, auVar93[5] = 0xff, auVar93[6] = 0xff,
                            auVar93[7] = 0xff, auVar93[8] = 0xff, auVar93[9] = 0xff,
                            auVar93[10] = 0xff, auVar93[0xb] = 0xff, auVar93[0xc] = 0xff,
                            auVar93[0xd] = 0xff, auVar93[0xe] = 0xff, auVar93[0xf] = 0xff,
                            auVar93 = auVar93 & auVar64,
                            (ushort)((ushort)(SUB161(auVar93 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar93 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar93 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar93 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar93 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar93 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar93 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar93 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar93 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar93 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar93 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar93 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar93 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar93 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar93 >> 0x77,0) & 1) << 0xe |
                                    (ushort)(byte)(auVar93[0xf] >> 7) << 0xf) == 0xffff ||
                            (CONCAT17(cStack_3ee,
                                      CONCAT16(cStack_3ef,
                                               CONCAT15(cStack_3f0,
                                                        CONCAT14(cStack_3f1,
                                                                 CONCAT13(cStack_3f2,
                                                                          CONCAT12(cStack_3f3,
                                                                                   CONCAT11(
                                                  cStack_3f4,cStack_3f5))))))) == 0x464552204b4c4320
                             && CONCAT17(cStack_3f5,
                                         CONCAT16(cStack_3f6,
                                                  CONCAT15(cStack_3f7,
                                                           CONCAT14(cStack_3f8,
                                                                    CONCAT13(cStack_3f9,
                                                                             CONCAT12(cStack_3fa,
                                                                                      CONCAT11(
                                                  cStack_3fb,local_3fc))))))) == 0x204e4f4954415453)
                            ) || ((CONCAT17(cStack_3ee,
                                            CONCAT16(cStack_3ef,
                                                     CONCAT15(cStack_3f0,
                                                              CONCAT14(cStack_3f1,
                                                                       CONCAT13(cStack_3f2,
                                                                                CONCAT12(cStack_3f3,
                                                                                         CONCAT11(
                                                  cStack_3f4,cStack_3f5))))))) == 0x5245544e45432053
                                   && CONCAT17(cStack_3f5,
                                               CONCAT16(cStack_3f6,
                                                        CONCAT15(cStack_3f7,
                                                                 CONCAT14(cStack_3f8,
                                                                          CONCAT13(cStack_3f9,
                                                                                   CONCAT12(
                                                  cStack_3fa,CONCAT11(cStack_3fb,local_3fc))))))) ==
                                      0x534953594c414e41 ||
                                  ((CONCAT13(cStack_3f1,
                                             CONCAT12(cStack_3f2,CONCAT11(cStack_3f3,cStack_3f4)))
                                    == 0x46455220 &&
                                    CONCAT17(cStack_3f5,
                                             CONCAT16(cStack_3f6,
                                                      CONCAT15(cStack_3f7,
                                                               CONCAT14(cStack_3f8,
                                                                        CONCAT13(cStack_3f9,
                                                                                 CONCAT12(cStack_3fa
                                                                                          ,CONCAT11(
                                                  cStack_3fb,local_3fc))))))) == 0x4b4c4320464f2023
                                   || (auVar65[0] = -(local_3fc == 'A'),
                                      auVar65[1] = -(cStack_3fb == 'N'),
                                      auVar65[2] = -(cStack_3fa == 'A'),
                                      auVar65[3] = -(cStack_3f9 == 'L'),
                                      auVar65[4] = -(cStack_3f8 == 'Y'),
                                      auVar65[5] = -(cStack_3f7 == 'S'),
                                      auVar65[6] = -(cStack_3f6 == 'I'),
                                      auVar65[7] = -(cStack_3f5 == 'S'),
                                      auVar65[8] = -(cStack_3f4 == ' '),
                                      auVar65[9] = -(cStack_3f3 == 'C'),
                                      auVar65[10] = -(cStack_3f2 == 'L'),
                                      auVar65[0xb] = -(cStack_3f1 == 'K'),
                                      auVar65[0xc] = -(cStack_3f0 == ' '),
                                      auVar65[0xd] = -(cStack_3ef == 'R'),
                                      auVar65[0xe] = -(cStack_3ee == 'E'),
                                      auVar65[0xf] = -(cStack_3ed == 'F'),
                                      (ushort)((ushort)(SUB161(auVar65 >> 7,0) & 1) |
                                               (ushort)(SUB161(auVar65 >> 0xf,0) & 1) << 1 |
                                               (ushort)(SUB161(auVar65 >> 0x17,0) & 1) << 2 |
                                               (ushort)(SUB161(auVar65 >> 0x1f,0) & 1) << 3 |
                                               (ushort)(SUB161(auVar65 >> 0x27,0) & 1) << 4 |
                                               (ushort)(SUB161(auVar65 >> 0x2f,0) & 1) << 5 |
                                               (ushort)(SUB161(auVar65 >> 0x37,0) & 1) << 6 |
                                               (ushort)(SUB161(auVar65 >> 0x3f,0) & 1) << 7 |
                                               (ushort)(SUB161(auVar65 >> 0x47,0) & 1) << 8 |
                                               (ushort)(SUB161(auVar65 >> 0x4f,0) & 1) << 9 |
                                               (ushort)(SUB161(auVar65 >> 0x57,0) & 1) << 10 |
                                               (ushort)(SUB161(auVar65 >> 0x5f,0) & 1) << 0xb |
                                               (ushort)(SUB161(auVar65 >> 0x67,0) & 1) << 0xc |
                                               (ushort)(SUB161(auVar65 >> 0x6f,0) & 1) << 0xd |
                                               (ushort)(SUB161(auVar65 >> 0x77,0) & 1) << 0xe |
                                              (ushort)(auVar65[0xf] >> 7) << 0xf) == 0xffff))))))))
                         || ((auVar66[0] = -(local_3fc == '#'), auVar66[1] = -(cStack_3fb == ' '),
                             auVar66[2] = -(cStack_3fa == 'O'), auVar66[3] = -(cStack_3f9 == 'F'),
                             auVar66[4] = -(cStack_3f8 == ' '), auVar66[5] = -(cStack_3f7 == 'S'),
                             auVar66[6] = -(cStack_3f6 == 'O'), auVar66[7] = -(cStack_3f5 == 'L'),
                             auVar66[8] = -(cStack_3f4 == 'N'), auVar66[9] = -(cStack_3f3 == ' '),
                             auVar66[10] = -(cStack_3f2 == 'S'), auVar66[0xb] = -(cStack_3f1 == 'T')
                             , auVar66[0xc] = -(cStack_3f0 == 'A'),
                             auVar66[0xd] = -(cStack_3ef == ' '),
                             auVar66[0xe] = -(cStack_3ee == '/'),
                             auVar66[0xf] = -(cStack_3ed == ' '), auVar94[0] = -(cStack_3f9 == 'F'),
                             auVar94[1] = -(cStack_3f8 == ' '), auVar94[2] = -(cStack_3f7 == 'S'),
                             auVar94[3] = -(cStack_3f6 == 'O'), auVar94[4] = -(cStack_3f5 == 'L'),
                             auVar94[5] = -(cStack_3f4 == 'N'), auVar94[6] = -(cStack_3f3 == ' '),
                             auVar94[7] = -(cStack_3f2 == 'S'), auVar94[8] = -(cStack_3f1 == 'T'),
                             auVar94[9] = -(cStack_3f0 == 'A'), auVar94[10] = -(cStack_3ef == ' '),
                             auVar94[0xb] = -(cStack_3ee == '/'),
                             auVar94[0xc] = -(cStack_3ed == ' '), auVar94[0xd] = -(local_3ec == 'T')
                             , auVar94[0xe] = -(cStack_3eb == 'R'),
                             auVar94[0xf] = -(cStack_3ea == 'F'), auVar94 = auVar94 & auVar66,
                             (ushort)((ushort)(SUB161(auVar94 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar94 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar94 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar94 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar94 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar94 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar94 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar94 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar94 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar94 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar94 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar94 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar94 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar94 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar94 >> 0x77,0) & 1) << 0xe |
                                     (ushort)(byte)(auVar94[0xf] >> 7) << 0xf) == 0xffff ||
                             (((auVar67[0] = -(local_3fc == 'S'), auVar67[1] = -(cStack_3fb == 'O'),
                               auVar67[2] = -(cStack_3fa == 'L'), auVar67[3] = -(cStack_3f9 == 'N'),
                               auVar67[4] = -(cStack_3f8 == ' '), auVar67[5] = -(cStack_3f7 == 'S'),
                               auVar67[6] = -(cStack_3f6 == 'T'), auVar67[7] = -(cStack_3f5 == 'A'),
                               auVar67[8] = -(cStack_3f4 == ' '), auVar67[9] = -(cStack_3f3 == 'N'),
                               auVar67[10] = -(cStack_3f2 == 'A'),
                               auVar67[0xb] = -(cStack_3f1 == 'M'),
                               auVar67[0xc] = -(cStack_3f0 == 'E'),
                               auVar67[0xd] = -(cStack_3ef == ' '),
                               auVar67[0xe] = -(cStack_3ee == '/'),
                               auVar67[0xf] = -(cStack_3ed == ' '),
                               auVar95[0] = -(cStack_3f9 == 'N'), auVar95[1] = -(cStack_3f8 == ' '),
                               auVar95[2] = -(cStack_3f7 == 'S'), auVar95[3] = -(cStack_3f6 == 'T'),
                               auVar95[4] = -(cStack_3f5 == 'A'), auVar95[5] = -(cStack_3f4 == ' '),
                               auVar95[6] = -(cStack_3f3 == 'N'), auVar95[7] = -(cStack_3f2 == 'A'),
                               auVar95[8] = -(cStack_3f1 == 'M'), auVar95[9] = -(cStack_3f0 == 'E'),
                               auVar95[10] = -(cStack_3ef == ' '),
                               auVar95[0xb] = -(cStack_3ee == '/'),
                               auVar95[0xc] = -(cStack_3ed == ' '),
                               auVar95[0xd] = -(local_3ec == 'N'),
                               auVar95[0xe] = -(cStack_3eb == 'U'),
                               auVar95[0xf] = -(cStack_3ea == 'M'), auVar95 = auVar95 & auVar67,
                               (ushort)((ushort)(SUB161(auVar95 >> 7,0) & 1) |
                                        (ushort)(SUB161(auVar95 >> 0xf,0) & 1) << 1 |
                                        (ushort)(SUB161(auVar95 >> 0x17,0) & 1) << 2 |
                                        (ushort)(SUB161(auVar95 >> 0x1f,0) & 1) << 3 |
                                        (ushort)(SUB161(auVar95 >> 0x27,0) & 1) << 4 |
                                        (ushort)(SUB161(auVar95 >> 0x2f,0) & 1) << 5 |
                                        (ushort)(SUB161(auVar95 >> 0x37,0) & 1) << 6 |
                                        (ushort)(SUB161(auVar95 >> 0x3f,0) & 1) << 7 |
                                        (ushort)(SUB161(auVar95 >> 0x47,0) & 1) << 8 |
                                        (ushort)(SUB161(auVar95 >> 0x4f,0) & 1) << 9 |
                                        (ushort)(SUB161(auVar95 >> 0x57,0) & 1) << 10 |
                                        (ushort)(SUB161(auVar95 >> 0x5f,0) & 1) << 0xb |
                                        (ushort)(SUB161(auVar95 >> 0x67,0) & 1) << 0xc |
                                        (ushort)(SUB161(auVar95 >> 0x6f,0) & 1) << 0xd |
                                        (ushort)(SUB161(auVar95 >> 0x77,0) & 1) << 0xe |
                                       (ushort)(byte)(auVar95[0xf] >> 7) << 0xf) == 0xffff ||
                               (CONCAT17(cStack_3ef,
                                         CONCAT16(cStack_3f0,
                                                  CONCAT15(cStack_3f1,
                                                           CONCAT14(cStack_3f2,
                                                                    CONCAT13(cStack_3f3,
                                                                             CONCAT12(cStack_3f4,
                                                                                      CONCAT11(
                                                  cStack_3f5,cStack_3f6))))))) == 0x53544153204e4c4f
                                && CONCAT17(cStack_3f5,
                                            CONCAT16(cStack_3f6,
                                                     CONCAT15(cStack_3f7,
                                                              CONCAT14(cStack_3f8,
                                                                       CONCAT13(cStack_3f9,
                                                                                CONCAT12(cStack_3fa,
                                                                                         CONCAT11(
                                                  cStack_3fb,local_3fc))))))) == 0x4c4f5320464f2023)
                               ) || (CONCAT17(cStack_3f5,
                                              CONCAT16(cStack_3f6,
                                                       CONCAT15(cStack_3f7,
                                                                CONCAT14(cStack_3f8,
                                                                         CONCAT13(cStack_3f9,
                                                                                  CONCAT12(
                                                  cStack_3fa,CONCAT11(cStack_3fb,local_3fc))))))) ==
                                     0x5453494c204e5250)))))) goto LAB_001575a0;
                      if (CONCAT17(cStack_3f0,
                                   CONCAT16(cStack_3f1,
                                            CONCAT15(cStack_3f2,
                                                     CONCAT14(cStack_3f3,
                                                              CONCAT13(cStack_3f4,
                                                                       CONCAT12(cStack_3f5,
                                                                                CONCAT11(cStack_3f6,
                                                                                         cStack_3f7)
                                                                               )))))) ==
                          0x5245444145482046 &&
                          CONCAT17(cStack_3f5,
                                   CONCAT16(cStack_3f6,
                                            CONCAT15(cStack_3f7,
                                                     CONCAT14(cStack_3f8,
                                                              CONCAT13(cStack_3f9,
                                                                       CONCAT12(cStack_3fa,
                                                                                CONCAT11(cStack_3fb,
                                                                                         local_3fc))
                                                                      ))))) == 0x4820464f20444e45)
                      goto LAB_001579df;
                      goto LAB_001579b7;
                    }
                    uStack_5f0 = 0x15764e;
                    lVar23 = coda_ascii_parse_int64(local_438,6,(int64_t *)&local_5a0,0);
                    lVar22 = local_4a8._8_8_;
                    if (lVar23 < 0) goto LAB_0015768f;
                    uStack_5f0 = 0x15766e;
                    pcVar24 = coda_mem_int32_new(*(coda_type_number **)(*plVar1 + 0x148),
                                                 (coda_dynamic_type *)0x0,
                                                 (coda_product *)local_590._8_8_,local_5a0);
                    pcVar32 = "leap_seconds";
                  }
LAB_0015757f:
                  uStack_5f0 = 0x157589;
                  coda_mem_record_add_field
                            ((coda_mem_record *)local_590._16_8_,pcVar32,
                             (coda_dynamic_type *)pcVar24,0);
                }
              }
LAB_001575a0:
              uStack_5f0 = 0x1575aa;
              local_4a8._8_8_ = ftell((FILE *)local_590._0_8_);
              local_4a8._0_8_ = local_4a8._0_8_ + 1;
              uStack_5f0 = 0x1575c7;
              uVar21 = get_line((FILE *)local_590._0_8_,local_438);
            } while (-1 < (int)uVar21);
          }
          goto LAB_00155226;
        }
        uStack_5f0 = 0x155443;
        pcVar25 = coda_type_record_new(coda_format_rinex);
        local_498._0_8_ = pcVar25;
        uStack_5f0 = 0x155457;
        pcVar26 = coda_type_record_field_new("epoch");
        uStack_5f0 = 0x155470;
        coda_type_record_field_set_type(pcVar26,*(coda_type **)(*(long *)(lVar23 + 0x1118) + 0x168))
        ;
        uStack_5f0 = 0x155480;
        coda_type_record_add_field((coda_type_record *)local_498._0_8_,pcVar26);
        uStack_5f0 = 0x15548c;
        pcVar26 = coda_type_record_field_new("flag");
        uStack_5f0 = 0x1554a5;
        coda_type_record_field_set_type(pcVar26,*(coda_type **)(*(long *)(lVar23 + 0x1118) + 0x170))
        ;
        uStack_5f0 = 0x1554b5;
        coda_type_record_add_field((coda_type_record *)local_498._0_8_,pcVar26);
        uStack_5f0 = 0x1554c1;
        pcVar26 = coda_type_record_field_new("receiver_clock_offset");
        uStack_5f0 = 0x1554da;
        coda_type_record_field_set_type(pcVar26,*(coda_type **)(*(long *)(lVar23 + 0x1118) + 0x178))
        ;
        uStack_5f0 = 0x1554ea;
        coda_type_record_add_field((coda_type_record *)local_498._0_8_,pcVar26);
        uStack_5f0 = 0x1554ff;
        pcVar27 = coda_mem_array_new(*(coda_type_array **)(*(long *)(lVar23 + 0x1118) + 0x100),
                                     (coda_dynamic_type *)0x0);
        local_488 = (undefined1  [8])pcVar27;
        uStack_5f0 = 0x155511;
        local_4a8._8_8_ = ftell((FILE *)local_590._0_8_);
        local_4a8._0_8_ = local_4a8._0_8_ + 1;
        uStack_5f0 = 0x155533;
        uVar21 = get_line((FILE *)local_590._0_8_,local_438);
        if ((int)uVar21 < 0) goto LAB_00155226;
        plVar1 = (long *)(lVar23 + 0x1118);
        local_448 = 0x5552202f204d4750;
        uStack_440 = 0x44202f205942204e;
        local_458 = 0x42204e5552202f20;
        uStack_450 = 0x45544144202f2059;
LAB_001555ad:
        uVar19 = uStack_5bf;
        uVar18 = uStack_5c0;
        uVar17 = uStack_5c8;
        uVar16 = uStack_5d0;
        cVar15 = cStack_5d9;
        uVar14 = uStack_5e0;
        uVar13 = uStack_5e1;
        uVar12 = uStack_5e2;
        cVar11 = cStack_5e5;
        cVar10 = cStack_5e6;
        cVar9 = cStack_5e7;
        cVar8 = local_5e8;
        if (uVar21 == 0) {
LAB_00157ab4:
          uStack_5f0 = 0x157acf;
          local_5e8 = cVar8;
          cStack_5e7 = cVar9;
          cStack_5e6 = cVar10;
          cStack_5e5 = cVar11;
          uStack_5e2 = uVar12;
          uStack_5e1 = uVar13;
          uStack_5e0 = uVar14;
          cStack_5d9 = cVar15;
          uStack_5d0 = uVar16;
          uStack_5c8 = uVar17;
          uStack_5c0 = uVar18;
          uStack_5bf = uVar19;
          coda_mem_record_add_field
                    ((coda_mem_record *)local_590._16_8_,"sys",(coda_dynamic_type *)local_488,0);
          auVar7._8_8_ = 0;
          auVar7._0_8_ = pcStack_480;
          _local_488 = auVar7 << 0x40;
          uStack_5f0 = 0x157ae5;
          local_4a8._8_8_ = ftell((FILE *)local_590._0_8_);
          local_4a8._0_8_ = local_4a8._0_8_ + 1;
          uStack_5f0 = 0x157aff;
          iVar20 = coda_mem_record_validate((coda_mem_record *)local_590._16_8_);
          if (iVar20 == 0) {
            uStack_5f0 = 0x157b11;
            pcVar30 = coda_type_array_new(coda_format_rinex);
            uStack_5f0 = 0x157b1e;
            coda_type_array_add_variable_dimension(pcVar30,(coda_expression *)0x0);
            uStack_5f0 = 0x157b32;
            coda_type_array_set_base_type(pcVar30,(coda_type *)local_498._0_8_);
            uStack_5f0 = 0x157b3c;
            pcVar27 = coda_mem_array_new(pcVar30,(coda_dynamic_type *)0x0);
            pcStack_480 = pcVar27;
            uStack_5f0 = 0x157b4b;
            coda_type_release((coda_type *)pcVar30);
            uStack_5f0 = 0x157b53;
            iVar20 = read_observation_records((ingest_info *)local_590);
LAB_00157b53:
            if (iVar20 == 0) {
              puVar33 = (undefined8 *)(local_488 + 8);
              uStack_5f0 = 0x157b6d;
              pcVar25 = coda_type_record_new(coda_format_rinex);
              uStack_5f0 = 0x157b7a;
              pcVar31 = coda_mem_record_new(pcVar25,(coda_dynamic_type *)0x0);
              uStack_5f0 = 0x157b85;
              coda_type_release((coda_type *)pcVar25);
              uStack_5f0 = 0x157ba1;
              coda_mem_record_add_field(pcVar31,"header",(coda_dynamic_type *)local_590._16_8_,1);
              local_590._16_8_ = (coda_mem_record *)0x0;
              pcVar32 = "record";
              iVar20 = 1;
              field_type_00 = (undefined1  [8])pcStack_480;
LAB_00157bc0:
              uStack_5f0 = 0x157bc5;
              coda_mem_record_add_field(pcVar31,pcVar32,(coda_dynamic_type *)field_type_00,iVar20);
              *puVar33 = 0;
              product->root_type = (coda_dynamic_type *)pcVar31;
              uStack_5f0 = 0x157bdb;
              ingest_info_cleanup((ingest_info *)local_590);
              return 0;
            }
          }
          goto LAB_00155226;
        }
        if (uVar21 < 0x3d) goto LAB_001576a2;
        auVar37[0] = -(local_3fc == (char)local_448);
        auVar37[1] = -(cStack_3fb == local_448._1_1_);
        auVar37[2] = -(cStack_3fa == local_448._2_1_);
        auVar37[3] = -(cStack_3f9 == local_448._3_1_);
        auVar37[4] = -(cStack_3f8 == local_448._4_1_);
        auVar37[5] = -(cStack_3f7 == local_448._5_1_);
        auVar37[6] = -(cStack_3f6 == local_448._6_1_);
        auVar37[7] = -(cStack_3f5 == local_448._7_1_);
        auVar37[8] = -(cStack_3f4 == (char)uStack_440);
        auVar37[9] = -(cStack_3f3 == uStack_440._1_1_);
        auVar37[10] = -(cStack_3f2 == uStack_440._2_1_);
        auVar37[0xb] = -(cStack_3f1 == uStack_440._3_1_);
        auVar37[0xc] = -(cStack_3f0 == uStack_440._4_1_);
        auVar37[0xd] = -(cStack_3ef == uStack_440._5_1_);
        auVar37[0xe] = -(cStack_3ee == uStack_440._6_1_);
        auVar37[0xf] = -(cStack_3ed == uStack_440._7_1_);
        auVar69[0] = -(cStack_3f9 == (char)local_458);
        auVar69[1] = -(cStack_3f8 == local_458._1_1_);
        auVar69[2] = -(cStack_3f7 == local_458._2_1_);
        auVar69[3] = -(cStack_3f6 == local_458._3_1_);
        auVar69[4] = -(cStack_3f5 == local_458._4_1_);
        auVar69[5] = -(cStack_3f4 == local_458._5_1_);
        auVar69[6] = -(cStack_3f3 == local_458._6_1_);
        auVar69[7] = -(cStack_3f2 == local_458._7_1_);
        auVar69[8] = -(cStack_3f1 == (char)uStack_450);
        auVar69[9] = -(cStack_3f0 == uStack_450._1_1_);
        auVar69[10] = -(cStack_3ef == uStack_450._2_1_);
        auVar69[0xb] = -(cStack_3ee == uStack_450._3_1_);
        auVar69[0xc] = -(cStack_3ed == uStack_450._4_1_);
        auVar69[0xd] = -(local_3ec == uStack_450._5_1_);
        auVar69[0xe] = -(cStack_3eb == uStack_450._6_1_);
        auVar69[0xf] = -(cStack_3ea == uStack_450._7_1_);
        auVar69 = auVar69 & auVar37;
        uStack_5e2 = (undefined1)acStack_433._1_2_;
        uStack_5e1 = SUB21(acStack_433._1_2_,1);
        cStack_5d9 = (char)((ulong)stack0xfffffffffffffbd0 >> 0x38);
        uStack_5e0 = (undefined7)stack0xfffffffffffffbd0;
        local_5e8 = (char)_local_438;
        cStack_5e7 = (char)((uint)_local_438 >> 8);
        cStack_5e6 = (char)((uint)_local_438 >> 0x10);
        cStack_5e5 = (char)((uint)_local_438 >> 0x18);
        if ((ushort)((ushort)(SUB161(auVar69 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar69 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar69 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar69 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar69 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar69 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar69 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar69 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar69 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar69 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar69 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar69 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar69 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar69 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar69 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar69[0xf] >> 7) << 0xf) == 0xffff) {
          local_5d8 = (uint5)local_428;
          uStack_5f0 = 0x155b80;
          sVar28 = strlen(&local_5e8);
          if (0 < (long)sVar28) {
            lVar22 = sVar28 + 1;
            do {
              if (*(char *)((long)&uStack_5f0 + lVar22 + 6) != ' ') break;
              *(undefined1 *)((long)&uStack_5f0 + lVar22 + 6) = 0;
              lVar22 = lVar22 + -1;
            } while (1 < lVar22);
          }
          uStack_5f0 = 0x155bb3;
          pcVar24 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x18),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          uStack_5f0 = 0x155bc9;
          coda_mem_record_add_field
                    ((coda_mem_record *)local_590._16_8_,"program",(coda_dynamic_type *)pcVar24,0);
          local_5e8 = (char)uStack_424;
          cStack_5e7 = (char)(uStack_424 >> 8);
          cStack_5e6 = (char)(uStack_424 >> 0x10);
          cStack_5e5 = (char)(uStack_424 >> 0x18);
          cStack_5e4 = (char)uStack_420;
          cStack_5e3 = (char)((uint)uStack_420 >> 8);
          uStack_5e2 = (undefined1)((uint)uStack_420 >> 0x10);
          uStack_5e1 = (undefined1)((uint)uStack_420 >> 0x18);
          uStack_5e0 = (undefined7)CONCAT44(uStack_418,uStack_41c);
          cStack_5d9 = (char)((uint)uStack_418 >> 0x18);
          _local_5d8 = CONCAT44(stack0xfffffffffffffa2c,uStack_414);
          uStack_5f0 = 0x155be4;
          sVar28 = strlen(&local_5e8);
          if (0 < (long)sVar28) {
            lVar22 = sVar28 + 1;
            do {
              if (*(char *)((long)&uStack_5f0 + lVar22 + 6) != ' ') break;
              *(undefined1 *)((long)&uStack_5f0 + lVar22 + 6) = 0;
              lVar22 = lVar22 + -1;
            } while (1 < lVar22);
          }
          uStack_5f0 = 0x155c17;
          pcVar24 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x20),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          uStack_5f0 = 0x155c2d;
          coda_mem_record_add_field
                    ((coda_mem_record *)local_590._16_8_,"run_by",(coda_dynamic_type *)pcVar24,0);
          local_5e8 = (char)uStack_410;
          cStack_5e7 = (char)((uint)uStack_410 >> 8);
          cStack_5e6 = (char)((uint)uStack_410 >> 0x10);
          cStack_5e5 = (char)((uint)uStack_410 >> 0x18);
          cStack_5e4 = (char)uStack_40c;
          cStack_5e3 = (char)((uint)uStack_40c >> 8);
          uStack_5e2 = (undefined1)((uint)uStack_40c >> 0x10);
          uStack_5e1 = uStack_40c._3_1_;
          uStack_5e0 = (undefined7)
                       (CONCAT44(uStack_405,
                                 CONCAT13(cStack_406,CONCAT21(uStack_408,uStack_40c._3_1_))) >> 8);
          cStack_5d9 = '\0';
          uStack_5f0 = 0x155c59;
          pcVar24 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x30),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          uStack_5f0 = 0x155c6a;
          pcVar29 = coda_mem_time_new(*(coda_type_special **)(*plVar1 + 0x28),
                                      (coda_dynamic_type *)0x0,(coda_dynamic_type *)pcVar24);
          uStack_5f0 = 0x155c80;
          coda_mem_record_add_field
                    ((coda_mem_record *)local_590._16_8_,"datetime",(coda_dynamic_type *)pcVar29,0);
          local_5e8 = (char)local_400;
          cStack_5e7 = (char)((ushort)local_400 >> 8);
          cStack_5e6 = cStack_3fe;
          cStack_5e5 = 0;
          uStack_5f0 = 0x155cac;
          pcVar24 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x38),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          pcVar32 = "datetime_time_zone";
          goto LAB_0015610b;
        }
        if (CONCAT13(cStack_3f6,CONCAT12(cStack_3f7,CONCAT11(cStack_3f8,cStack_3f9))) == 0x544e454d
            && CONCAT13(cStack_3f9,CONCAT12(cStack_3fa,CONCAT11(cStack_3fb,local_3fc))) ==
               0x4d4d4f43) goto LAB_00156115;
        uStack_5c8 = (undefined3)uStack_418;
        uStack_5d0 = (undefined3)uStack_420;
        uStack_5bf = (undefined2)((uint)uStack_410 >> 8);
        uStack_5c0 = (undefined1)uStack_410;
        if (CONCAT17(cStack_3f2,
                     CONCAT16(cStack_3f3,
                              CONCAT15(cStack_3f4,
                                       CONCAT14(cStack_3f5,
                                                CONCAT13(cStack_3f6,
                                                         CONCAT12(cStack_3f7,
                                                                  CONCAT11(cStack_3f8,cStack_3f9))))
                                      ))) == 0x454d414e2052454b &&
            CONCAT17(cStack_3f5,
                     CONCAT16(cStack_3f6,
                              CONCAT15(cStack_3f7,
                                       CONCAT14(cStack_3f8,
                                                CONCAT13(cStack_3f9,
                                                         CONCAT12(cStack_3fa,
                                                                  CONCAT11(cStack_3fb,local_3fc)))))
                             )) == 0x4e2052454b52414d) {
          uStack_5b4 = CONCAT17(uStack_3fd,
                                CONCAT16(cStack_3fe,
                                         CONCAT24(local_400,CONCAT13(cStack_401,uStack_405._1_3_))))
          ;
          uStack_5b8 = (undefined4)
                       (CONCAT17((undefined1)uStack_405,
                                 CONCAT16(cStack_406,CONCAT24(uStack_408,uStack_40c))) >> 0x20);
          _local_5d8 = CONCAT44(uStack_424,local_428);
          uStack_5c5 = (undefined5)(CONCAT44(uStack_414,uStack_418) >> 0x18);
          uStack_5bd = (undefined1)((uint)uStack_410 >> 0x18);
          uStack_5cd = (undefined5)(CONCAT44(uStack_41c,uStack_420) >> 0x18);
          cStack_5e4 = cStack_434;
          cStack_5e3 = acStack_433[0];
          local_5ac = 0;
          uStack_5f0 = 0x155d03;
          sVar28 = strlen(&local_5e8);
          if (0 < (long)sVar28) {
            lVar22 = sVar28 + 1;
            do {
              if (*(char *)((long)&uStack_5f0 + lVar22 + 6) != ' ') break;
              *(undefined1 *)((long)&uStack_5f0 + lVar22 + 6) = 0;
              lVar22 = lVar22 + -1;
            } while (1 < lVar22);
          }
          uStack_5f0 = 0x155d36;
          pcVar24 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x40),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          pcVar32 = "marker_name";
LAB_0015610b:
          uStack_5f0 = 0x156115;
          coda_mem_record_add_field
                    ((coda_mem_record *)local_590._16_8_,pcVar32,(coda_dynamic_type *)pcVar24,0);
          cVar8 = local_5e8;
          cVar9 = cStack_5e7;
          cVar10 = cStack_5e6;
          cVar11 = cStack_5e5;
          uVar12 = uStack_5e2;
          uVar13 = uStack_5e1;
          uVar14 = uStack_5e0;
          cVar15 = cStack_5d9;
          uVar16 = uStack_5d0;
          uVar17 = uStack_5c8;
          uVar18 = uStack_5c0;
          uVar19 = uStack_5bf;
          goto LAB_00156115;
        }
        if (CONCAT17(cStack_3f0,
                     CONCAT16(cStack_3f1,
                              CONCAT15(cStack_3f2,
                                       CONCAT14(cStack_3f3,
                                                CONCAT13(cStack_3f4,
                                                         CONCAT12(cStack_3f5,
                                                                  CONCAT11(cStack_3f6,cStack_3f7))))
                                      ))) == 0x5245424d554e2052 &&
            CONCAT17(cStack_3f5,
                     CONCAT16(cStack_3f6,
                              CONCAT15(cStack_3f7,
                                       CONCAT14(cStack_3f8,
                                                CONCAT13(cStack_3f9,
                                                         CONCAT12(cStack_3fa,
                                                                  CONCAT11(cStack_3fb,local_3fc)))))
                             )) == 0x4e2052454b52414d) {
          cStack_5e4 = cStack_434;
          cStack_5e3 = acStack_433[0];
          local_5d8 = (uint5)local_428;
          uStack_5f0 = 0x155d6d;
          uStack_5d0 = uVar16;
          uStack_5c8 = uVar17;
          uStack_5c0 = uVar18;
          uStack_5bf = uVar19;
          sVar28 = strlen(&local_5e8);
          if (0 < (long)sVar28) {
            lVar22 = sVar28 + 1;
            do {
              if (*(char *)((long)&uStack_5f0 + lVar22 + 6) != ' ') break;
              *(undefined1 *)((long)&uStack_5f0 + lVar22 + 6) = 0;
              lVar22 = lVar22 + -1;
            } while (1 < lVar22);
          }
          uStack_5f0 = 0x155da0;
          pcVar24 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x48),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          pcVar32 = "marker_number";
          goto LAB_0015610b;
        }
        if (CONCAT11(cStack_3f3,cStack_3f4) == 0x5059 &&
            CONCAT17(cStack_3f5,
                     CONCAT16(cStack_3f6,
                              CONCAT15(cStack_3f7,
                                       CONCAT14(cStack_3f8,
                                                CONCAT13(cStack_3f9,
                                                         CONCAT12(cStack_3fa,
                                                                  CONCAT11(cStack_3fb,local_3fc)))))
                             )) == 0x542052454b52414d) {
          cStack_5e4 = cStack_434;
          cStack_5e3 = acStack_433[0];
          local_5d8 = (uint5)local_428;
          uStack_5f0 = 0x155dd7;
          uStack_5d0 = uVar16;
          uStack_5c8 = uVar17;
          uStack_5c0 = uVar18;
          uStack_5bf = uVar19;
          sVar28 = strlen(&local_5e8);
          if (0 < (long)sVar28) {
            lVar22 = sVar28 + 1;
            do {
              if (*(char *)((long)&uStack_5f0 + lVar22 + 6) != ' ') break;
              *(undefined1 *)((long)&uStack_5f0 + lVar22 + 6) = 0;
              lVar22 = lVar22 + -1;
            } while (1 < lVar22);
          }
          uStack_5f0 = 0x155e0a;
          pcVar24 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x50),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          pcVar32 = "marker_type";
          goto LAB_0015610b;
        }
        auVar38[0] = -(local_3fc == 'O');
        auVar38[1] = -(cStack_3fb == 'B');
        auVar38[2] = -(cStack_3fa == 'S');
        auVar38[3] = -(cStack_3f9 == 'E');
        auVar38[4] = -(cStack_3f8 == 'R');
        auVar38[5] = -(cStack_3f7 == 'V');
        auVar38[6] = -(cStack_3f6 == 'E');
        auVar38[7] = -(cStack_3f5 == 'R');
        auVar38[8] = -(cStack_3f4 == ' ');
        auVar38[9] = -(cStack_3f3 == '/');
        auVar38[10] = -(cStack_3f2 == ' ');
        auVar38[0xb] = -(cStack_3f1 == 'A');
        auVar38[0xc] = -(cStack_3f0 == 'G');
        auVar38[0xd] = -(cStack_3ef == 'E');
        auVar38[0xe] = -(cStack_3ee == 'N');
        auVar38[0xf] = -(cStack_3ed == 'C');
        auVar70[0] = -(local_3ec == 'Y');
        auVar70[1] = 0xff;
        auVar70[2] = 0xff;
        auVar70[3] = 0xff;
        auVar70[4] = 0xff;
        auVar70[5] = 0xff;
        auVar70[6] = 0xff;
        auVar70[7] = 0xff;
        auVar70[8] = 0xff;
        auVar70[9] = 0xff;
        auVar70[10] = 0xff;
        auVar70[0xb] = 0xff;
        auVar70[0xc] = 0xff;
        auVar70[0xd] = 0xff;
        auVar70[0xe] = 0xff;
        auVar70[0xf] = 0xff;
        auVar70 = auVar70 & auVar38;
        if ((ushort)((ushort)(SUB161(auVar70 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar70 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar70 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar70 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar70 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar70 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar70 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar70 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar70 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar70 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar70 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar70 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar70 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar70 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar70 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar70[0xf] >> 7) << 0xf) == 0xffff) {
          local_5d8 = (uint5)local_428;
          uStack_5f0 = 0x155e41;
          uStack_5d0 = uVar16;
          uStack_5c8 = uVar17;
          uStack_5c0 = uVar18;
          uStack_5bf = uVar19;
          sVar28 = strlen(&local_5e8);
          if (0 < (long)sVar28) {
            lVar22 = sVar28 + 1;
            do {
              if (*(char *)((long)&uStack_5f0 + lVar22 + 6) != ' ') break;
              *(undefined1 *)((long)&uStack_5f0 + lVar22 + 6) = 0;
              lVar22 = lVar22 + -1;
            } while (1 < lVar22);
          }
          uStack_5f0 = 0x155e74;
          pcVar24 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x58),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          uStack_5f0 = 0x155e8a;
          coda_mem_record_add_field
                    ((coda_mem_record *)local_590._16_8_,"observer",(coda_dynamic_type *)pcVar24,0);
          _local_5d8 = CONCAT44(uStack_410,uStack_414);
          local_5e8 = (char)uStack_424;
          cStack_5e7 = (char)(uStack_424 >> 8);
          cStack_5e6 = (char)(uStack_424 >> 0x10);
          cStack_5e5 = (char)(uStack_424 >> 0x18);
          cStack_5e4 = (char)uStack_420;
          cStack_5e3 = (char)((uint)uStack_420 >> 8);
          uStack_5e2 = (undefined1)((uint)uStack_420 >> 0x10);
          uStack_5e1 = (undefined1)((uint)uStack_420 >> 0x18);
          uStack_5e0 = (undefined7)CONCAT44(uStack_418,uStack_41c);
          cStack_5d9 = (char)((uint)uStack_418 >> 0x18);
          uStack_5d0 = (undefined3)uStack_40c;
          uStack_5cd = (undefined5)
                       (CONCAT17((undefined1)uStack_405,
                                 CONCAT16(cStack_406,CONCAT24(uStack_408,uStack_40c))) >> 0x18);
          uStack_5c8 = uStack_405._1_3_;
          uStack_5c5 = (undefined5)
                       (CONCAT17(uStack_3fd,
                                 CONCAT16(cStack_3fe,
                                          CONCAT24(local_400,CONCAT13(cStack_401,uStack_405._1_3_)))
                                ) >> 0x18);
          uStack_5c0 = 0;
          uStack_5f0 = 0x155eb7;
          sVar28 = strlen(&local_5e8);
          if (0 < (long)sVar28) {
            lVar22 = sVar28 + 1;
            do {
              if (*(char *)((long)&uStack_5f0 + lVar22 + 6) != ' ') break;
              *(undefined1 *)((long)&uStack_5f0 + lVar22 + 6) = 0;
              lVar22 = lVar22 + -1;
            } while (1 < lVar22);
          }
          uStack_5f0 = 0x155eea;
          pcVar24 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x60),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          pcVar32 = "agency";
          goto LAB_0015610b;
        }
        auVar39[0] = -(local_3fc == 'R');
        auVar39[1] = -(cStack_3fb == 'E');
        auVar39[2] = -(cStack_3fa == 'C');
        auVar39[3] = -(cStack_3f9 == ' ');
        auVar39[4] = -(cStack_3f8 == '#');
        auVar39[5] = -(cStack_3f7 == ' ');
        auVar39[6] = -(cStack_3f6 == '/');
        auVar39[7] = -(cStack_3f5 == ' ');
        auVar39[8] = -(cStack_3f4 == 'T');
        auVar39[9] = -(cStack_3f3 == 'Y');
        auVar39[10] = -(cStack_3f2 == 'P');
        auVar39[0xb] = -(cStack_3f1 == 'E');
        auVar39[0xc] = -(cStack_3f0 == ' ');
        auVar39[0xd] = -(cStack_3ef == '/');
        auVar39[0xe] = -(cStack_3ee == ' ');
        auVar39[0xf] = -(cStack_3ed == 'V');
        auVar71[0] = -(cStack_3f9 == ' ');
        auVar71[1] = -(cStack_3f8 == '#');
        auVar71[2] = -(cStack_3f7 == ' ');
        auVar71[3] = -(cStack_3f6 == '/');
        auVar71[4] = -(cStack_3f5 == ' ');
        auVar71[5] = -(cStack_3f4 == 'T');
        auVar71[6] = -(cStack_3f3 == 'Y');
        auVar71[7] = -(cStack_3f2 == 'P');
        auVar71[8] = -(cStack_3f1 == 'E');
        auVar71[9] = -(cStack_3f0 == ' ');
        auVar71[10] = -(cStack_3ef == '/');
        auVar71[0xb] = -(cStack_3ee == ' ');
        auVar71[0xc] = -(cStack_3ed == 'V');
        auVar71[0xd] = -(local_3ec == 'E');
        auVar71[0xe] = -(cStack_3eb == 'R');
        auVar71[0xf] = -(cStack_3ea == 'S');
        auVar71 = auVar71 & auVar39;
        if ((ushort)((ushort)(SUB161(auVar71 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar71 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar71 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar71 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar71 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar71 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar71 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar71 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar71 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar71 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar71 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar71 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar71 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar71 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar71 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar71[0xf] >> 7) << 0xf) == 0xffff) {
          local_5d8 = (uint5)local_428;
          uStack_5f0 = 0x155f21;
          uStack_5d0 = uVar16;
          uStack_5c8 = uVar17;
          uStack_5c0 = uVar18;
          uStack_5bf = uVar19;
          sVar28 = strlen(&local_5e8);
          if (0 < (long)sVar28) {
            lVar22 = sVar28 + 1;
            do {
              if (*(char *)((long)&uStack_5f0 + lVar22 + 6) != ' ') break;
              *(undefined1 *)((long)&uStack_5f0 + lVar22 + 6) = 0;
              lVar22 = lVar22 + -1;
            } while (1 < lVar22);
          }
          uStack_5f0 = 0x155f54;
          pcVar24 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x68),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          uStack_5f0 = 0x155f6a;
          coda_mem_record_add_field
                    ((coda_mem_record *)local_590._16_8_,"receiver_number",
                     (coda_dynamic_type *)pcVar24,0);
          local_5e8 = (char)uStack_424;
          cStack_5e7 = (char)(uStack_424 >> 8);
          cStack_5e6 = (char)(uStack_424 >> 0x10);
          cStack_5e5 = (char)(uStack_424 >> 0x18);
          cStack_5e4 = (char)uStack_420;
          cStack_5e3 = (char)((uint)uStack_420 >> 8);
          uStack_5e2 = (undefined1)((uint)uStack_420 >> 0x10);
          uStack_5e1 = (undefined1)((uint)uStack_420 >> 0x18);
          uStack_5e0 = (undefined7)CONCAT44(uStack_418,uStack_41c);
          cStack_5d9 = (char)((uint)uStack_418 >> 0x18);
          local_5d8 = (uint5)uStack_414;
          uStack_5f0 = 0x155f8a;
          sVar28 = strlen(&local_5e8);
          if (0 < (long)sVar28) {
            lVar22 = sVar28 + 1;
            do {
              if (*(char *)((long)&uStack_5f0 + lVar22 + 6) != ' ') break;
              *(undefined1 *)((long)&uStack_5f0 + lVar22 + 6) = 0;
              lVar22 = lVar22 + -1;
            } while (1 < lVar22);
          }
          uStack_5f0 = 0x155fbd;
          pcVar24 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x70),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          uStack_5f0 = 0x155fd3;
          coda_mem_record_add_field
                    ((coda_mem_record *)local_590._16_8_,"receiver_type",
                     (coda_dynamic_type *)pcVar24,0);
          uStack_5e0 = CONCAT43(uStack_405,CONCAT12(cStack_406,uStack_408));
          local_5e8 = (char)uStack_410;
          cStack_5e7 = (char)((uint)uStack_410 >> 8);
          cStack_5e6 = (char)((uint)uStack_410 >> 0x10);
          cStack_5e5 = (char)((uint)uStack_410 >> 0x18);
          cStack_5e4 = (char)uStack_40c;
          cStack_5e3 = (char)((uint)uStack_40c >> 8);
          uStack_5e2 = (undefined1)((uint)uStack_40c >> 0x10);
          uStack_5e1 = (undefined1)((uint)uStack_40c >> 0x18);
          cStack_5d9 = cStack_401;
          local_5d8 = (uint5)CONCAT13(uStack_3fd,CONCAT12(cStack_3fe,local_400));
          uStack_5f0 = 0x155ff3;
          sVar28 = strlen(&local_5e8);
          if (0 < (long)sVar28) {
            lVar22 = sVar28 + 1;
            do {
              if (*(char *)((long)&uStack_5f0 + lVar22 + 6) != ' ') break;
              *(undefined1 *)((long)&uStack_5f0 + lVar22 + 6) = 0;
              lVar22 = lVar22 + -1;
            } while (1 < lVar22);
          }
          uStack_5f0 = 0x156026;
          pcVar24 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x78),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          pcVar32 = "receiver_version";
          goto LAB_0015610b;
        }
        if (CONCAT11(cStack_3f3,cStack_3f4) == 0x5954 &&
            CONCAT17(cStack_3f5,
                     CONCAT16(cStack_3f6,
                              CONCAT15(cStack_3f7,
                                       CONCAT14(cStack_3f8,
                                                CONCAT13(cStack_3f9,
                                                         CONCAT12(cStack_3fa,
                                                                  CONCAT11(cStack_3fb,local_3fc)))))
                             )) == 0x202f202320544e41) {
          local_5d8 = (uint5)local_428;
          uStack_5f0 = 0x15605d;
          uStack_5d0 = uVar16;
          uStack_5c8 = uVar17;
          uStack_5c0 = uVar18;
          uStack_5bf = uVar19;
          sVar28 = strlen(&local_5e8);
          if (0 < (long)sVar28) {
            lVar22 = sVar28 + 1;
            do {
              if (*(char *)((long)&uStack_5f0 + lVar22 + 6) != ' ') break;
              *(undefined1 *)((long)&uStack_5f0 + lVar22 + 6) = 0;
              lVar22 = lVar22 + -1;
            } while (1 < lVar22);
          }
          uStack_5f0 = 0x156093;
          pcVar24 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x80),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          uStack_5f0 = 0x1560a9;
          coda_mem_record_add_field
                    ((coda_mem_record *)local_590._16_8_,"antenna_number",
                     (coda_dynamic_type *)pcVar24,0);
          local_5e8 = (char)uStack_424;
          cStack_5e7 = (char)(uStack_424 >> 8);
          cStack_5e6 = (char)(uStack_424 >> 0x10);
          cStack_5e5 = (char)(uStack_424 >> 0x18);
          cStack_5e4 = (char)uStack_420;
          cStack_5e3 = (char)((uint)uStack_420 >> 8);
          uStack_5e2 = (undefined1)((uint)uStack_420 >> 0x10);
          uStack_5e1 = (undefined1)((uint)uStack_420 >> 0x18);
          uStack_5e0 = (undefined7)CONCAT44(uStack_418,uStack_41c);
          cStack_5d9 = (char)((uint)uStack_418 >> 0x18);
          local_5d8 = (uint5)uStack_414;
          uStack_5f0 = 0x1560c9;
          sVar28 = strlen(&local_5e8);
          if (0 < (long)sVar28) {
            lVar22 = sVar28 + 1;
            do {
              if (*(char *)((long)&uStack_5f0 + lVar22 + 6) != ' ') break;
              *(undefined1 *)((long)&uStack_5f0 + lVar22 + 6) = 0;
              lVar22 = lVar22 + -1;
            } while (1 < lVar22);
          }
          uStack_5f0 = 0x1560ff;
          pcVar24 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x88),
                                        (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                        &local_5e8);
          pcVar32 = "antenna_type";
          goto LAB_0015610b;
        }
        auVar40[0] = -(local_3fc == 'A');
        auVar40[1] = -(cStack_3fb == 'P');
        auVar40[2] = -(cStack_3fa == 'P');
        auVar40[3] = -(cStack_3f9 == 'R');
        auVar40[4] = -(cStack_3f8 == 'O');
        auVar40[5] = -(cStack_3f7 == 'X');
        auVar40[6] = -(cStack_3f6 == ' ');
        auVar40[7] = -(cStack_3f5 == 'P');
        auVar40[8] = -(cStack_3f4 == 'O');
        auVar40[9] = -(cStack_3f3 == 'S');
        auVar40[10] = -(cStack_3f2 == 'I');
        auVar40[0xb] = -(cStack_3f1 == 'T');
        auVar40[0xc] = -(cStack_3f0 == 'I');
        auVar40[0xd] = -(cStack_3ef == 'O');
        auVar40[0xe] = -(cStack_3ee == 'N');
        auVar40[0xf] = -(cStack_3ed == ' ');
        auVar72[0] = -(cStack_3f9 == 'R');
        auVar72[1] = -(cStack_3f8 == 'O');
        auVar72[2] = -(cStack_3f7 == 'X');
        auVar72[3] = -(cStack_3f6 == ' ');
        auVar72[4] = -(cStack_3f5 == 'P');
        auVar72[5] = -(cStack_3f4 == 'O');
        auVar72[6] = -(cStack_3f3 == 'S');
        auVar72[7] = -(cStack_3f2 == 'I');
        auVar72[8] = -(cStack_3f1 == 'T');
        auVar72[9] = -(cStack_3f0 == 'I');
        auVar72[10] = -(cStack_3ef == 'O');
        auVar72[0xb] = -(cStack_3ee == 'N');
        auVar72[0xc] = -(cStack_3ed == ' ');
        auVar72[0xd] = -(local_3ec == 'X');
        auVar72[0xe] = -(cStack_3eb == 'Y');
        auVar72[0xf] = -(cStack_3ea == 'Z');
        auVar72 = auVar72 & auVar40;
        if ((ushort)((ushort)(SUB161(auVar72 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar72 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar72 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar72 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar72 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar72 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar72 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar72 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar72 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar72 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar72 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar72 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar72 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar72 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar72 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar72[0xf] >> 7) << 0xf) == 0xffff) {
          uStack_5f0 = 0x156160;
          local_5e8 = cVar8;
          cStack_5e7 = cVar9;
          cStack_5e6 = cVar10;
          cStack_5e5 = cVar11;
          uStack_5e2 = uVar12;
          uStack_5e1 = uVar13;
          uStack_5e0 = uVar14;
          cStack_5d9 = cVar15;
          uStack_5d0 = uVar16;
          uStack_5c8 = uVar17;
          uStack_5c0 = uVar18;
          uStack_5bf = uVar19;
          lVar23 = coda_ascii_parse_double(local_438,0xe,(double *)&local_5a0,0);
          lVar22 = local_4a8._8_8_;
          if (lVar23 < 0) goto LAB_0015768f;
          uStack_5f0 = 0x156188;
          pcVar24 = coda_mem_float_new(*(coda_type_number **)(*plVar1 + 0x90),
                                       (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                       (float)(double)CONCAT44(uStack_59c,local_5a0));
          uStack_5f0 = 0x15619e;
          coda_mem_record_add_field
                    ((coda_mem_record *)local_590._16_8_,"approx_position_x",
                     (coda_dynamic_type *)pcVar24,0);
          uStack_5f0 = 0x1561b5;
          lVar22 = coda_ascii_parse_double(acStack_42a,0xe,(double *)&local_5a0,0);
          if (lVar22 < 0) {
LAB_00157934:
            lVar22 = local_4a8._8_8_ + 0xe;
            goto LAB_0015768f;
          }
          uStack_5f0 = 0x1561dd;
          pcVar24 = coda_mem_float_new(*(coda_type_number **)(*plVar1 + 0x98),
                                       (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                       (float)(double)CONCAT44(uStack_59c,local_5a0));
          uStack_5f0 = 0x1561f3;
          coda_mem_record_add_field
                    ((coda_mem_record *)local_590._16_8_,"approx_position_y",
                     (coda_dynamic_type *)pcVar24,0);
          uStack_5f0 = 0x15620a;
          lVar22 = coda_ascii_parse_double((char *)&uStack_41c,0xe,(double *)&local_5a0,0);
          if (lVar22 < 0) {
LAB_0015794d:
            lVar22 = local_4a8._8_8_ + 0x1c;
            goto LAB_0015768f;
          }
          uStack_5f0 = 0x156232;
          pcVar24 = coda_mem_float_new(*(coda_type_number **)(*plVar1 + 0xa0),
                                       (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                       (float)(double)CONCAT44(uStack_59c,local_5a0));
          pcVar32 = "approx_position_z";
        }
        else {
          auVar41[0] = -(local_3fc == 'A');
          auVar41[1] = -(cStack_3fb == 'N');
          auVar41[2] = -(cStack_3fa == 'T');
          auVar41[3] = -(cStack_3f9 == 'E');
          auVar41[4] = -(cStack_3f8 == 'N');
          auVar41[5] = -(cStack_3f7 == 'N');
          auVar41[6] = -(cStack_3f6 == 'A');
          auVar41[7] = -(cStack_3f5 == ':');
          auVar41[8] = -(cStack_3f4 == ' ');
          auVar41[9] = -(cStack_3f3 == 'D');
          auVar41[10] = -(cStack_3f2 == 'E');
          auVar41[0xb] = -(cStack_3f1 == 'L');
          auVar41[0xc] = -(cStack_3f0 == 'T');
          auVar41[0xd] = -(cStack_3ef == 'A');
          auVar41[0xe] = -(cStack_3ee == ' ');
          auVar41[0xf] = -(cStack_3ed == 'H');
          auVar73[0] = -(local_3ec == '/');
          auVar73[1] = -(cStack_3eb == 'E');
          cVar3 = (char)((uint)_local_3ec >> 0x18);
          auVar73[2] = -(cStack_3ea == '/');
          auVar73[3] = -(cVar3 == 'N');
          auVar73[4] = 0xff;
          auVar73[5] = 0xff;
          auVar73[6] = 0xff;
          auVar73[7] = 0xff;
          auVar73[8] = 0xff;
          auVar73[9] = 0xff;
          auVar73[10] = 0xff;
          auVar73[0xb] = 0xff;
          auVar73[0xc] = 0xff;
          auVar73[0xd] = 0xff;
          auVar73[0xe] = 0xff;
          auVar73[0xf] = 0xff;
          auVar73 = auVar73 & auVar41;
          if ((ushort)((ushort)(SUB161(auVar73 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar73 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar73 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar73 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar73 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar73 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar73 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar73 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar73 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar73 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar73 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar73 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar73 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar73 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar73 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar73[0xf] >> 7) << 0xf) == 0xffff) {
            uStack_5f0 = 0x15625a;
            local_5e8 = cVar8;
            cStack_5e7 = cVar9;
            cStack_5e6 = cVar10;
            cStack_5e5 = cVar11;
            uStack_5e2 = uVar12;
            uStack_5e1 = uVar13;
            uStack_5e0 = uVar14;
            cStack_5d9 = cVar15;
            uStack_5d0 = uVar16;
            uStack_5c8 = uVar17;
            uStack_5c0 = uVar18;
            uStack_5bf = uVar19;
            lVar22 = coda_ascii_parse_double(local_438,0xe,(double *)&local_5a0,0);
            if (-1 < lVar22) {
              uStack_5f0 = 0x156282;
              pcVar24 = coda_mem_float_new(*(coda_type_number **)(*plVar1 + 0xa8),
                                           (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                           (float)(double)CONCAT44(uStack_59c,local_5a0));
              uStack_5f0 = 0x156298;
              coda_mem_record_add_field
                        ((coda_mem_record *)local_590._16_8_,"antenna_delta_h",
                         (coda_dynamic_type *)pcVar24,0);
              uStack_5f0 = 0x1562af;
              lVar22 = coda_ascii_parse_double(acStack_42a,0xe,(double *)&local_5a0,0);
              if (lVar22 < 0) goto LAB_00157934;
              uStack_5f0 = 0x1562d7;
              pcVar24 = coda_mem_float_new(*(coda_type_number **)(*plVar1 + 0xb0),
                                           (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                           (float)(double)CONCAT44(uStack_59c,local_5a0));
              uStack_5f0 = 0x1562ed;
              coda_mem_record_add_field
                        ((coda_mem_record *)local_590._16_8_,"antenna_delta_e",
                         (coda_dynamic_type *)pcVar24,0);
              uStack_5f0 = 0x156304;
              lVar22 = coda_ascii_parse_double((char *)&uStack_41c,0xe,(double *)&local_5a0,0);
              if (lVar22 < 0) goto LAB_0015794d;
              uStack_5f0 = 0x15632c;
              pcVar24 = coda_mem_float_new(*(coda_type_number **)(*plVar1 + 0xb8),
                                           (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                           (float)(double)CONCAT44(uStack_59c,local_5a0));
              pcVar32 = "antenna_delta_n";
              goto LAB_00156338;
            }
            uStack_5f0 = 0x157989;
            coda_add_error_message
                      (" (line: %ld, byte offset: %ld)",local_4a8._0_8_,local_590._8_8_,
                       local_4a8._8_8_);
            goto LAB_00155226;
          }
          auVar42[0] = -(local_3fc == 'A');
          auVar42[1] = -(cStack_3fb == 'N');
          auVar42[2] = -(cStack_3fa == 'T');
          auVar42[3] = -(cStack_3f9 == 'E');
          auVar42[4] = -(cStack_3f8 == 'N');
          auVar42[5] = -(cStack_3f7 == 'N');
          auVar42[6] = -(cStack_3f6 == 'A');
          auVar42[7] = -(cStack_3f5 == ':');
          auVar42[8] = -(cStack_3f4 == ' ');
          auVar42[9] = -(cStack_3f3 == 'D');
          auVar42[10] = -(cStack_3f2 == 'E');
          auVar42[0xb] = -(cStack_3f1 == 'L');
          auVar42[0xc] = -(cStack_3f0 == 'T');
          auVar42[0xd] = -(cStack_3ef == 'A');
          auVar42[0xe] = -(cStack_3ee == ' ');
          auVar42[0xf] = -(cStack_3ed == 'X');
          auVar74[0] = -(local_3ec == '/');
          auVar74[1] = -(cStack_3eb == 'Y');
          auVar74[2] = -(cStack_3ea == '/');
          auVar74[3] = -(cVar3 == 'Z');
          auVar74[4] = 0xff;
          auVar74[5] = 0xff;
          auVar74[6] = 0xff;
          auVar74[7] = 0xff;
          auVar74[8] = 0xff;
          auVar74[9] = 0xff;
          auVar74[10] = 0xff;
          auVar74[0xb] = 0xff;
          auVar74[0xc] = 0xff;
          auVar74[0xd] = 0xff;
          auVar74[0xe] = 0xff;
          auVar74[0xf] = 0xff;
          auVar74 = auVar74 & auVar42;
          if ((((ushort)((ushort)(SUB161(auVar74 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar74 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar74 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar74 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar74 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar74 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar74 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar74 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar74 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar74 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar74 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar74 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar74 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar74 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar74 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar74[0xf] >> 7) << 0xf) == 0xffff) ||
              (auVar43[0] = -(local_3fc == 'A'), auVar43[1] = -(cStack_3fb == 'N'),
              auVar43[2] = -(cStack_3fa == 'T'), auVar43[3] = -(cStack_3f9 == 'E'),
              auVar43[4] = -(cStack_3f8 == 'N'), auVar43[5] = -(cStack_3f7 == 'N'),
              auVar43[6] = -(cStack_3f6 == 'A'), auVar43[7] = -(cStack_3f5 == ':'),
              auVar43[8] = -(cStack_3f4 == ' '), auVar43[9] = -(cStack_3f3 == 'P'),
              auVar43[10] = -(cStack_3f2 == 'H'), auVar43[0xb] = -(cStack_3f1 == 'A'),
              auVar43[0xc] = -(cStack_3f0 == 'S'), auVar43[0xd] = -(cStack_3ef == 'E'),
              auVar43[0xe] = -(cStack_3ee == 'C'), auVar43[0xf] = -(cStack_3ed == 'E'),
              auVar75[0] = -(local_3ec == 'N'), auVar75[1] = -(cStack_3eb == 'T'),
              auVar75[2] = -(cStack_3ea == 'E'), auVar75[3] = -(cVar3 == 'R'), auVar75[4] = 0xff,
              auVar75[5] = 0xff, auVar75[6] = 0xff, auVar75[7] = 0xff, auVar75[8] = 0xff,
              auVar75[9] = 0xff, auVar75[10] = 0xff, auVar75[0xb] = 0xff, auVar75[0xc] = 0xff,
              auVar75[0xd] = 0xff, auVar75[0xe] = 0xff, auVar75[0xf] = 0xff,
              auVar75 = auVar75 & auVar43,
              (ushort)((ushort)(SUB161(auVar75 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar75 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar75 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar75 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar75 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar75 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar75 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar75 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar75 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar75 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar75 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar75 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar75 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar75 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar75 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar75[0xf] >> 7) << 0xf) == 0xffff)) ||
             (((auVar44[0] = -(local_3fc == 'A'), auVar44[1] = -(cStack_3fb == 'N'),
               auVar44[2] = -(cStack_3fa == 'T'), auVar44[3] = -(cStack_3f9 == 'E'),
               auVar44[4] = -(cStack_3f8 == 'N'), auVar44[5] = -(cStack_3f7 == 'N'),
               auVar44[6] = -(cStack_3f6 == 'A'), auVar44[7] = -(cStack_3f5 == ':'),
               auVar44[8] = -(cStack_3f4 == ' '), auVar44[9] = -(cStack_3f3 == 'B'),
               auVar44[10] = -(cStack_3f2 == '.'), auVar44[0xb] = -(cStack_3f1 == 'S'),
               auVar44[0xc] = -(cStack_3f0 == 'I'), auVar44[0xd] = -(cStack_3ef == 'G'),
               auVar44[0xe] = -(cStack_3ee == 'H'), auVar44[0xf] = -(cStack_3ed == 'T'),
               auVar76[0] = -(local_3ec == ' '), auVar76[1] = -(cStack_3eb == 'X'),
               auVar76[2] = -(cStack_3ea == 'Y'), auVar76[3] = -(cVar3 == 'Z'), auVar76[4] = 0xff,
               auVar76[5] = 0xff, auVar76[6] = 0xff, auVar76[7] = 0xff, auVar76[8] = 0xff,
               auVar76[9] = 0xff, auVar76[10] = 0xff, auVar76[0xb] = 0xff, auVar76[0xc] = 0xff,
               auVar76[0xd] = 0xff, auVar76[0xe] = 0xff, auVar76[0xf] = 0xff,
               auVar76 = auVar76 & auVar44,
               (ushort)((ushort)(SUB161(auVar76 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar76 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar76 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar76 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar76 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar76 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar76 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar76 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar76 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar76 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar76 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar76 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar76 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar76 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar76 >> 0x77,0) & 1) << 0xe |
                       (ushort)(byte)(auVar76[0xf] >> 7) << 0xf) == 0xffff ||
               ((auVar45[0] = -(local_3fc == 'A'), auVar45[1] = -(cStack_3fb == 'N'),
                auVar45[2] = -(cStack_3fa == 'T'), auVar45[3] = -(cStack_3f9 == 'E'),
                auVar45[4] = -(cStack_3f8 == 'N'), auVar45[5] = -(cStack_3f7 == 'N'),
                auVar45[6] = -(cStack_3f6 == 'A'), auVar45[7] = -(cStack_3f5 == ':'),
                auVar45[8] = -(cStack_3f4 == ' '), auVar45[9] = -(cStack_3f3 == 'Z'),
                auVar45[10] = -(cStack_3f2 == 'E'), auVar45[0xb] = -(cStack_3f1 == 'R'),
                auVar45[0xc] = -(cStack_3f0 == 'O'), auVar45[0xd] = -(cStack_3ef == 'D'),
                auVar45[0xe] = -(cStack_3ee == 'I'), auVar45[0xf] = -(cStack_3ed == 'R'),
                auVar77[0] = -(local_3ec == ' '), auVar77[1] = -(cStack_3eb == 'A'),
                auVar77[2] = -(cStack_3ea == 'Z'), auVar77[3] = -(cVar3 == 'I'), auVar77[4] = 0xff,
                auVar77[5] = 0xff, auVar77[6] = 0xff, auVar77[7] = 0xff, auVar77[8] = 0xff,
                auVar77[9] = 0xff, auVar77[10] = 0xff, auVar77[0xb] = 0xff, auVar77[0xc] = 0xff,
                auVar77[0xd] = 0xff, auVar77[0xe] = 0xff, auVar77[0xf] = 0xff,
                auVar77 = auVar77 & auVar45,
                (ushort)((ushort)(SUB161(auVar77 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar77 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar77 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar77 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar77 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar77 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar77 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar77 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar77 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar77 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar77 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar77 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar77 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar77 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar77 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar77[0xf] >> 7) << 0xf) == 0xffff ||
                (auVar78[0] = -(local_3fc == 'A'), auVar78[1] = -(cStack_3fb == 'N'),
                auVar78[2] = -(cStack_3fa == 'T'), auVar78[3] = -(cStack_3f9 == 'E'),
                auVar78[4] = -(cStack_3f8 == 'N'), auVar78[5] = -(cStack_3f7 == 'N'),
                auVar78[6] = -(cStack_3f6 == 'A'), auVar78[7] = -(cStack_3f5 == ':'),
                auVar78[8] = -(cStack_3f4 == ' '), auVar78[9] = -(cStack_3f3 == 'Z'),
                auVar78[10] = -(cStack_3f2 == 'E'), auVar78[0xb] = -(cStack_3f1 == 'R'),
                auVar78[0xc] = -(cStack_3f0 == 'O'), auVar78[0xd] = -(cStack_3ef == 'D'),
                auVar78[0xe] = -(cStack_3ee == 'I'), auVar78[0xf] = -(cStack_3ed == 'R'),
                auVar46[0] = -(local_3ec == ' '), auVar46[1] = -(cStack_3eb == 'X'),
                auVar46[2] = -(cStack_3ea == 'Y'), auVar46[3] = -(cVar3 == 'Z'), auVar46[4] = 0xff,
                auVar46[5] = 0xff, auVar46[6] = 0xff, auVar46[7] = 0xff, auVar46[8] = 0xff,
                auVar46[9] = 0xff, auVar46[10] = 0xff, auVar46[0xb] = 0xff, auVar46[0xc] = 0xff,
                auVar46[0xd] = 0xff, auVar46[0xe] = 0xff, auVar46[0xf] = 0xff,
                auVar46 = auVar46 & auVar78,
                (ushort)((ushort)(SUB161(auVar46 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar46 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar46 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar46 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar46 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar46 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar46 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar46 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar46 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar46 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar46 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar46 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar46 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar46 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar46 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar46[0xf] >> 7) << 0xf) == 0xffff)))) ||
              (auVar47[0] = -(local_3fc == 'C'), auVar47[1] = -(cStack_3fb == 'E'),
              auVar47[2] = -(cStack_3fa == 'N'), auVar47[3] = -(cStack_3f9 == 'T'),
              auVar47[4] = -(cStack_3f8 == 'E'), auVar47[5] = -(cStack_3f7 == 'R'),
              auVar47[6] = -(cStack_3f6 == ' '), auVar47[7] = -(cStack_3f5 == 'O'),
              auVar47[8] = -(cStack_3f4 == 'F'), auVar47[9] = -(cStack_3f3 == ' '),
              auVar47[10] = -(cStack_3f2 == 'M'), auVar47[0xb] = -(cStack_3f1 == 'A'),
              auVar47[0xc] = -(cStack_3f0 == 'S'), auVar47[0xd] = -(cStack_3ef == 'S'),
              auVar47[0xe] = -(cStack_3ee == ':'), auVar47[0xf] = -(cStack_3ed == ' '),
              auVar79[0] = -(cStack_3f9 == 'T'), auVar79[1] = -(cStack_3f8 == 'E'),
              auVar79[2] = -(cStack_3f7 == 'R'), auVar79[3] = -(cStack_3f6 == ' '),
              auVar79[4] = -(cStack_3f5 == 'O'), auVar79[5] = -(cStack_3f4 == 'F'),
              auVar79[6] = -(cStack_3f3 == ' '), auVar79[7] = -(cStack_3f2 == 'M'),
              auVar79[8] = -(cStack_3f1 == 'A'), auVar79[9] = -(cStack_3f0 == 'S'),
              auVar79[10] = -(cStack_3ef == 'S'), auVar79[0xb] = -(cStack_3ee == ':'),
              auVar79[0xc] = -(cStack_3ed == ' '), auVar79[0xd] = -(local_3ec == 'X'),
              auVar79[0xe] = -(cStack_3eb == 'Y'), auVar79[0xf] = -(cStack_3ea == 'Z'),
              auVar79 = auVar79 & auVar47,
              (ushort)((ushort)(SUB161(auVar79 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar79 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar79 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar79 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar79 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar79 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar79 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar79 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar79 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar79 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar79 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar79 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar79 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar79 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar79 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar79[0xf] >> 7) << 0xf) == 0xffff)))) goto LAB_00156115;
          auVar48[0] = -(local_3fc == 'S');
          auVar48[1] = -(cStack_3fb == 'Y');
          auVar48[2] = -(cStack_3fa == 'S');
          auVar48[3] = -(cStack_3f9 == ' ');
          auVar48[4] = -(cStack_3f8 == '/');
          auVar48[5] = -(cStack_3f7 == ' ');
          auVar48[6] = -(cStack_3f6 == '#');
          auVar48[7] = -(cStack_3f5 == ' ');
          auVar48[8] = -(cStack_3f4 == '/');
          auVar48[9] = -(cStack_3f3 == ' ');
          auVar48[10] = -(cStack_3f2 == 'O');
          auVar48[0xb] = -(cStack_3f1 == 'B');
          auVar48[0xc] = -(cStack_3f0 == 'S');
          auVar48[0xd] = -(cStack_3ef == ' ');
          auVar48[0xe] = -(cStack_3ee == 'T');
          auVar48[0xf] = -(cStack_3ed == 'Y');
          auVar80[0] = -(cStack_3f9 == ' ');
          auVar80[1] = -(cStack_3f8 == '/');
          auVar80[2] = -(cStack_3f7 == ' ');
          auVar80[3] = -(cStack_3f6 == '#');
          auVar80[4] = -(cStack_3f5 == ' ');
          auVar80[5] = -(cStack_3f4 == '/');
          auVar80[6] = -(cStack_3f3 == ' ');
          auVar80[7] = -(cStack_3f2 == 'O');
          auVar80[8] = -(cStack_3f1 == 'B');
          auVar80[9] = -(cStack_3f0 == 'S');
          auVar80[10] = -(cStack_3ef == ' ');
          auVar80[0xb] = -(cStack_3ee == 'T');
          auVar80[0xc] = -(cStack_3ed == 'Y');
          auVar80[0xd] = -(local_3ec == 'P');
          auVar80[0xe] = -(cStack_3eb == 'E');
          auVar80[0xf] = -(cStack_3ea == 'S');
          auVar80 = auVar80 & auVar48;
          if ((ushort)((ushort)(SUB161(auVar80 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar80 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar80 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar80 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar80 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar80 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar80 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar80 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar80 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar80 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar80 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar80 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar80 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar80 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar80 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar80[0xf] >> 7) << 0xf) == 0xffff) {
            uStack_5f0 = 0x156356;
            local_5e8 = cVar8;
            cStack_5e7 = cVar9;
            cStack_5e6 = cVar10;
            cStack_5e5 = cVar11;
            uStack_5e2 = uVar12;
            uStack_5e1 = uVar13;
            uStack_5e0 = uVar14;
            cStack_5d9 = cVar15;
            uStack_5d0 = uVar16;
            uStack_5c8 = uVar17;
            uStack_5c0 = uVar18;
            uStack_5bf = uVar19;
            iVar20 = handle_observation_definition((ingest_info *)local_590,local_438);
            cVar8 = local_5e8;
            cVar9 = cStack_5e7;
            cVar10 = cStack_5e6;
            cVar11 = cStack_5e5;
            uVar12 = uStack_5e2;
            uVar13 = uStack_5e1;
            uVar14 = uStack_5e0;
            cVar15 = cStack_5d9;
            uVar16 = uStack_5d0;
            uVar17 = uStack_5c8;
            uVar18 = uStack_5c0;
            uVar19 = uStack_5bf;
            if (iVar20 != 0) goto LAB_00155226;
            goto LAB_00156115;
          }
          auVar49[0] = -(local_3fc == 'S');
          auVar49[1] = -(cStack_3fb == 'I');
          auVar49[2] = -(cStack_3fa == 'G');
          auVar49[3] = -(cStack_3f9 == 'N');
          auVar49[4] = -(cStack_3f8 == 'A');
          auVar49[5] = -(cStack_3f7 == 'L');
          auVar49[6] = -(cStack_3f6 == ' ');
          auVar49[7] = -(cStack_3f5 == 'S');
          auVar49[8] = -(cStack_3f4 == 'T');
          auVar49[9] = -(cStack_3f3 == 'R');
          auVar49[10] = -(cStack_3f2 == 'E');
          auVar49[0xb] = -(cStack_3f1 == 'N');
          auVar49[0xc] = -(cStack_3f0 == 'G');
          auVar49[0xd] = -(cStack_3ef == 'T');
          auVar49[0xe] = -(cStack_3ee == 'H');
          auVar49[0xf] = -(cStack_3ed == ' ');
          auVar81[0] = -(local_3ec == 'U');
          auVar81[1] = -(cStack_3eb == 'N');
          auVar81[2] = -(cStack_3ea == 'I');
          auVar81[3] = -(cVar3 == 'T');
          auVar81[4] = 0xff;
          auVar81[5] = 0xff;
          auVar81[6] = 0xff;
          auVar81[7] = 0xff;
          auVar81[8] = 0xff;
          auVar81[9] = 0xff;
          auVar81[10] = 0xff;
          auVar81[0xb] = 0xff;
          auVar81[0xc] = 0xff;
          auVar81[0xd] = 0xff;
          auVar81[0xe] = 0xff;
          auVar81[0xf] = 0xff;
          auVar81 = auVar81 & auVar49;
          if ((ushort)((ushort)(SUB161(auVar81 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar81 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar81 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar81 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar81 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar81 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar81 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar81 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar81 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar81 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar81 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar81 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar81 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar81 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar81 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar81[0xf] >> 7) << 0xf) == 0xffff) {
            cStack_5e4 = cStack_434;
            cStack_5e3 = acStack_433[0];
            local_5d8 = (uint5)local_428;
            uStack_5f0 = 0x15638e;
            uStack_5d0 = uVar16;
            uStack_5c8 = uVar17;
            uStack_5c0 = uVar18;
            uStack_5bf = uVar19;
            rtrim(&local_5e8);
            uStack_5f0 = 0x1563a7;
            pcVar24 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x108),
                                          (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                          &local_5e8);
            pcVar32 = "signal_strength_unit";
          }
          else if (CONCAT17(cStack_3f5,
                            CONCAT16(cStack_3f6,
                                     CONCAT15(cStack_3f7,
                                              CONCAT14(cStack_3f8,
                                                       CONCAT13(cStack_3f9,
                                                                CONCAT12(cStack_3fa,
                                                                         CONCAT11(cStack_3fb,
                                                                                  local_3fc)))))))
                   == 0x4c41565245544e49) {
            uStack_5f0 = 0x1563c9;
            local_5e8 = cVar8;
            cStack_5e7 = cVar9;
            cStack_5e6 = cVar10;
            cStack_5e5 = cVar11;
            uStack_5e2 = uVar12;
            uStack_5e1 = uVar13;
            uStack_5e0 = uVar14;
            cStack_5d9 = cVar15;
            uStack_5d0 = uVar16;
            uStack_5c8 = uVar17;
            uStack_5c0 = uVar18;
            uStack_5bf = uVar19;
            lVar23 = coda_ascii_parse_double(local_438,10,(double *)&local_5a0,0);
            lVar22 = local_4a8._8_8_;
            if (lVar23 < 0) goto LAB_0015768f;
            uStack_5f0 = 0x1563ee;
            pcVar24 = coda_mem_double_new(*(coda_type_number **)(*plVar1 + 0x110),
                                          (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_,
                                          (double)CONCAT44(uStack_59c,local_5a0));
            pcVar32 = "obs_interval";
          }
          else {
            auVar50[0] = -(local_3fc == 'T');
            auVar50[1] = -(cStack_3fb == 'I');
            auVar50[2] = -(cStack_3fa == 'M');
            auVar50[3] = -(cStack_3f9 == 'E');
            auVar50[4] = -(cStack_3f8 == ' ');
            auVar50[5] = -(cStack_3f7 == 'O');
            auVar50[6] = -(cStack_3f6 == 'F');
            auVar50[7] = -(cStack_3f5 == ' ');
            auVar50[8] = -(cStack_3f4 == 'F');
            auVar50[9] = -(cStack_3f3 == 'I');
            auVar50[10] = -(cStack_3f2 == 'R');
            auVar50[0xb] = -(cStack_3f1 == 'S');
            auVar50[0xc] = -(cStack_3f0 == 'T');
            auVar50[0xd] = -(cStack_3ef == ' ');
            auVar50[0xe] = -(cStack_3ee == 'O');
            auVar50[0xf] = -(cStack_3ed == 'B');
            auVar82[0] = -(local_3ec == 'S');
            auVar82[1] = 0xff;
            auVar82[2] = 0xff;
            auVar82[3] = 0xff;
            auVar82[4] = 0xff;
            auVar82[5] = 0xff;
            auVar82[6] = 0xff;
            auVar82[7] = 0xff;
            auVar82[8] = 0xff;
            auVar82[9] = 0xff;
            auVar82[10] = 0xff;
            auVar82[0xb] = 0xff;
            auVar82[0xc] = 0xff;
            auVar82[0xd] = 0xff;
            auVar82[0xe] = 0xff;
            auVar82[0xf] = 0xff;
            auVar82 = auVar82 & auVar50;
            if ((ushort)((ushort)(SUB161(auVar82 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar82 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar82 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar82 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar82 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar82 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar82 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar82 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar82 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar82 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar82 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar82 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar82 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar82 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar82 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar82[0xf] >> 7) << 0xf) == 0xffff) {
              uStack_5c5 = CONCAT41(uStack_414,uStack_418._3_1_);
              _local_5d8 = CONCAT44(uStack_424,local_428);
              uStack_5cd = (undefined5)(CONCAT44(uStack_41c,uStack_420) >> 0x18);
              cStack_5e4 = cStack_434;
              cStack_5e3 = acStack_433[0];
              uStack_5bd = 0;
              uStack_5f0 = 0x156449;
              pcVar24 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x120),
                                            (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_
                                            ,&local_5e8);
              uStack_5f0 = 0x15645d;
              pcVar29 = coda_mem_time_new(*(coda_type_special **)(*plVar1 + 0x118),
                                          (coda_dynamic_type *)0x0,(coda_dynamic_type *)pcVar24);
              uStack_5f0 = 0x156473;
              coda_mem_record_add_field
                        ((coda_mem_record *)local_590._16_8_,"time_of_first_obs",
                         (coda_dynamic_type *)pcVar29,0);
              local_5e8 = (char)uStack_408;
              cStack_5e7 = (char)((ushort)uStack_408 >> 8);
              cStack_5e6 = cStack_406;
              if (CONCAT12(cStack_406,uStack_408) == 0x202020) {
                if (cStack_4af == 'E') {
                  local_5e8 = 'G';
                  cStack_5e7 = 'A';
                  cStack_5e6 = 'L';
                }
                else if (cStack_4af == 'R') {
                  local_5e8 = 'G';
                  cStack_5e7 = 'L';
                  cStack_5e6 = 'O';
                }
                else if (cStack_4af == 'G') {
                  local_5e8 = 'G';
                  cStack_5e7 = 'P';
                  cStack_5e6 = 'S';
                }
              }
              cStack_5e5 = 0;
              uStack_5f0 = 0x1565fd;
              pcVar24 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x138),
                                            (coda_dynamic_type *)0x0,(coda_product *)local_590._8_8_
                                            ,&local_5e8);
              pcVar32 = "time_of_first_obs_time_zone";
            }
            else {
              auVar51[0] = -(local_3fc == 'T');
              auVar51[1] = -(cStack_3fb == 'I');
              auVar51[2] = -(cStack_3fa == 'M');
              auVar51[3] = -(cStack_3f9 == 'E');
              auVar51[4] = -(cStack_3f8 == ' ');
              auVar51[5] = -(cStack_3f7 == 'O');
              auVar51[6] = -(cStack_3f6 == 'F');
              auVar51[7] = -(cStack_3f5 == ' ');
              auVar51[8] = -(cStack_3f4 == 'L');
              auVar51[9] = -(cStack_3f3 == 'A');
              auVar51[10] = -(cStack_3f2 == 'S');
              auVar51[0xb] = -(cStack_3f1 == 'T');
              auVar51[0xc] = -(cStack_3f0 == ' ');
              auVar51[0xd] = -(cStack_3ef == 'O');
              auVar51[0xe] = -(cStack_3ee == 'B');
              auVar51[0xf] = -(cStack_3ed == 'S');
              if ((ushort)((ushort)(SUB161(auVar51 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar51 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar51 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar51 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar51 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar51 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar51 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar51 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar51 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar51 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar51 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar51 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar51 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar51 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar51 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar51[0xf] >> 7) << 0xf) == 0xffff) {
                uStack_5c5 = CONCAT41(uStack_414,uStack_418._3_1_);
                _local_5d8 = CONCAT44(uStack_424,local_428);
                uStack_5cd = (undefined5)(CONCAT44(uStack_41c,uStack_420) >> 0x18);
                cStack_5e4 = cStack_434;
                cStack_5e3 = acStack_433[0];
                uStack_5bd = 0;
                uStack_5f0 = 0x15650f;
                pcVar24 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x130),
                                              (coda_dynamic_type *)0x0,
                                              (coda_product *)local_590._8_8_,&local_5e8);
                uStack_5f0 = 0x156523;
                pcVar29 = coda_mem_time_new(*(coda_type_special **)(*plVar1 + 0x128),
                                            (coda_dynamic_type *)0x0,(coda_dynamic_type *)pcVar24);
                uStack_5f0 = 0x156539;
                coda_mem_record_add_field
                          ((coda_mem_record *)local_590._16_8_,"time_of_last_obs",
                           (coda_dynamic_type *)pcVar29,0);
                local_5e8 = (char)uStack_408;
                cStack_5e7 = (char)((ushort)uStack_408 >> 8);
                cStack_5e6 = cStack_406;
                if (CONCAT12(cStack_406,uStack_408) == 0x202020) {
                  if (cStack_4af == 'E') {
                    local_5e8 = 'G';
                    cStack_5e7 = 'A';
                    cStack_5e6 = 'L';
                  }
                  else if (cStack_4af == 'R') {
                    local_5e8 = 'G';
                    cStack_5e7 = 'L';
                    cStack_5e6 = 'O';
                  }
                  else if (cStack_4af == 'G') {
                    local_5e8 = 'G';
                    cStack_5e7 = 'P';
                    cStack_5e6 = 'S';
                  }
                }
                cStack_5e5 = 0;
                uStack_5f0 = 0x156637;
                pcVar24 = coda_mem_string_new(*(coda_type_text **)(*plVar1 + 0x138),
                                              (coda_dynamic_type *)0x0,
                                              (coda_product *)local_590._8_8_,&local_5e8);
                pcVar32 = "time_of_last_obs_time_zone";
              }
              else {
                auVar52[0] = -(local_3fc == 'R');
                auVar52[1] = -(cStack_3fb == 'C');
                auVar52[2] = -(cStack_3fa == 'V');
                auVar52[3] = -(cStack_3f9 == ' ');
                auVar52[4] = -(cStack_3f8 == 'C');
                auVar52[5] = -(cStack_3f7 == 'L');
                auVar52[6] = -(cStack_3f6 == 'O');
                auVar52[7] = -(cStack_3f5 == 'C');
                auVar52[8] = -(cStack_3f4 == 'K');
                auVar52[9] = -(cStack_3f3 == ' ');
                auVar52[10] = -(cStack_3f2 == 'O');
                auVar52[0xb] = -(cStack_3f1 == 'F');
                auVar52[0xc] = -(cStack_3f0 == 'F');
                auVar52[0xd] = -(cStack_3ef == 'S');
                auVar52[0xe] = -(cStack_3ee == ' ');
                auVar52[0xf] = -(cStack_3ed == 'A');
                auVar83[0] = -(cStack_3f9 == ' ');
                auVar83[1] = -(cStack_3f8 == 'C');
                auVar83[2] = -(cStack_3f7 == 'L');
                auVar83[3] = -(cStack_3f6 == 'O');
                auVar83[4] = -(cStack_3f5 == 'C');
                auVar83[5] = -(cStack_3f4 == 'K');
                auVar83[6] = -(cStack_3f3 == ' ');
                auVar83[7] = -(cStack_3f2 == 'O');
                auVar83[8] = -(cStack_3f1 == 'F');
                auVar83[9] = -(cStack_3f0 == 'F');
                auVar83[10] = -(cStack_3ef == 'S');
                auVar83[0xb] = -(cStack_3ee == ' ');
                auVar83[0xc] = -(cStack_3ed == 'A');
                auVar83[0xd] = -(local_3ec == 'P');
                auVar83[0xe] = -(cStack_3eb == 'P');
                auVar83[0xf] = -(cStack_3ea == 'L');
                auVar83 = auVar83 & auVar52;
                if ((ushort)((ushort)(SUB161(auVar83 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar83 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar83 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar83 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar83 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar83 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar83 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar83 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar83 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar83 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar83 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar83 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar83 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar83 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar83 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar83[0xf] >> 7) << 0xf) == 0xffff) {
                  uStack_5f0 = 0x15659f;
                  local_5e8 = cVar8;
                  cStack_5e7 = cVar9;
                  cStack_5e6 = cVar10;
                  cStack_5e5 = cVar11;
                  uStack_5e2 = uVar12;
                  uStack_5e1 = uVar13;
                  uStack_5e0 = uVar14;
                  cStack_5d9 = cVar15;
                  uStack_5d0 = uVar16;
                  uStack_5c8 = uVar17;
                  uStack_5c0 = uVar18;
                  uStack_5bf = uVar19;
                  lVar23 = coda_ascii_parse_int64(local_438,6,(int64_t *)local_598,0);
                  lVar22 = local_4a8._8_8_;
                  if (lVar23 < 0) goto LAB_0015768f;
                  uStack_5f0 = 0x1565c3;
                  pcVar24 = coda_mem_uint8_new(*(coda_type_number **)(*plVar1 + 0x140),
                                               (coda_dynamic_type *)0x0,
                                               (coda_product *)local_590._8_8_,(uint8_t)local_598[0]
                                              );
                  pcVar32 = "rcv_clock_offs_appl";
                }
                else {
                  auVar53[0] = -(local_3fc == 'S');
                  auVar53[1] = -(cStack_3fb == 'Y');
                  auVar53[2] = -(cStack_3fa == 'S');
                  auVar53[3] = -(cStack_3f9 == ' ');
                  auVar53[4] = -(cStack_3f8 == '/');
                  auVar53[5] = -(cStack_3f7 == ' ');
                  auVar53[6] = -(cStack_3f6 == 'D');
                  auVar53[7] = -(cStack_3f5 == 'C');
                  auVar53[8] = -(cStack_3f4 == 'B');
                  auVar53[9] = -(cStack_3f3 == 'S');
                  auVar53[10] = -(cStack_3f2 == ' ');
                  auVar53[0xb] = -(cStack_3f1 == 'A');
                  auVar53[0xc] = -(cStack_3f0 == 'P');
                  auVar53[0xd] = -(cStack_3ef == 'P');
                  auVar53[0xe] = -(cStack_3ee == 'L');
                  auVar53[0xf] = -(cStack_3ed == 'I');
                  auVar84[0] = -(local_3ec == 'E');
                  auVar84[1] = -(cStack_3eb == 'D');
                  auVar84[2] = 0xff;
                  auVar84[3] = 0xff;
                  auVar84[4] = 0xff;
                  auVar84[5] = 0xff;
                  auVar84[6] = 0xff;
                  auVar84[7] = 0xff;
                  auVar84[8] = 0xff;
                  auVar84[9] = 0xff;
                  auVar84[10] = 0xff;
                  auVar84[0xb] = 0xff;
                  auVar84[0xc] = 0xff;
                  auVar84[0xd] = 0xff;
                  auVar84[0xe] = 0xff;
                  auVar84[0xf] = 0xff;
                  auVar84 = auVar84 & auVar53;
                  if ((((ushort)((ushort)(SUB161(auVar84 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar84 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar84 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar84 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar84 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar84 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar84 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar84 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar84 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar84 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar84 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar84 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar84 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar84 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar84 >> 0x77,0) & 1) << 0xe |
                                (ushort)(byte)(auVar84[0xf] >> 7) << 0xf) == 0xffff) ||
                      (auVar54[0] = -(local_3fc == 'S'), auVar54[1] = -(cStack_3fb == 'Y'),
                      auVar54[2] = -(cStack_3fa == 'S'), auVar54[3] = -(cStack_3f9 == ' '),
                      auVar54[4] = -(cStack_3f8 == '/'), auVar54[5] = -(cStack_3f7 == ' '),
                      auVar54[6] = -(cStack_3f6 == 'P'), auVar54[7] = -(cStack_3f5 == 'C'),
                      auVar54[8] = -(cStack_3f4 == 'V'), auVar54[9] = -(cStack_3f3 == 'S'),
                      auVar54[10] = -(cStack_3f2 == ' '), auVar54[0xb] = -(cStack_3f1 == 'A'),
                      auVar54[0xc] = -(cStack_3f0 == 'P'), auVar54[0xd] = -(cStack_3ef == 'P'),
                      auVar54[0xe] = -(cStack_3ee == 'L'), auVar54[0xf] = -(cStack_3ed == 'I'),
                      auVar85[0] = -(local_3ec == 'E'), auVar85[1] = -(cStack_3eb == 'D'),
                      auVar85[2] = 0xff, auVar85[3] = 0xff, auVar85[4] = 0xff, auVar85[5] = 0xff,
                      auVar85[6] = 0xff, auVar85[7] = 0xff, auVar85[8] = 0xff, auVar85[9] = 0xff,
                      auVar85[10] = 0xff, auVar85[0xb] = 0xff, auVar85[0xc] = 0xff,
                      auVar85[0xd] = 0xff, auVar85[0xe] = 0xff, auVar85[0xf] = 0xff,
                      auVar85 = auVar85 & auVar54,
                      (ushort)((ushort)(SUB161(auVar85 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar85 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar85 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar85 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar85 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar85 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar85 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar85 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar85 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar85 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar85 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar85 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar85 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar85 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar85 >> 0x77,0) & 1) << 0xe |
                              (ushort)(byte)(auVar85[0xf] >> 7) << 0xf) == 0xffff)) ||
                     (auVar55[0] = -(local_3fc == 'S'), auVar55[1] = -(cStack_3fb == 'Y'),
                     auVar55[2] = -(cStack_3fa == 'S'), auVar55[3] = -(cStack_3f9 == ' '),
                     auVar55[4] = -(cStack_3f8 == '/'), auVar55[5] = -(cStack_3f7 == ' '),
                     auVar55[6] = -(cStack_3f6 == 'S'), auVar55[7] = -(cStack_3f5 == 'C'),
                     auVar55[8] = -(cStack_3f4 == 'A'), auVar55[9] = -(cStack_3f3 == 'L'),
                     auVar55[10] = -(cStack_3f2 == 'E'), auVar55[0xb] = -(cStack_3f1 == ' '),
                     auVar55[0xc] = -(cStack_3f0 == 'F'), auVar55[0xd] = -(cStack_3ef == 'A'),
                     auVar55[0xe] = -(cStack_3ee == 'C'), auVar55[0xf] = -(cStack_3ed == 'T'),
                     auVar86[0] = -(local_3ec == 'O'), auVar86[1] = -(cStack_3eb == 'R'),
                     auVar86[2] = 0xff, auVar86[3] = 0xff, auVar86[4] = 0xff, auVar86[5] = 0xff,
                     auVar86[6] = 0xff, auVar86[7] = 0xff, auVar86[8] = 0xff, auVar86[9] = 0xff,
                     auVar86[10] = 0xff, auVar86[0xb] = 0xff, auVar86[0xc] = 0xff,
                     auVar86[0xd] = 0xff, auVar86[0xe] = 0xff, auVar86[0xf] = 0xff,
                     auVar86 = auVar86 & auVar55,
                     (ushort)((ushort)(SUB161(auVar86 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar86 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar86 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar86 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar86 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar86 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar86 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar86 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar86 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar86 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar86 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar86 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar86 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar86 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar86 >> 0x77,0) & 1) << 0xe |
                             (ushort)(byte)(auVar86[0xf] >> 7) << 0xf) == 0xffff))
                  goto LAB_00156115;
                  if (CONCAT13(cStack_3f1,CONCAT12(cStack_3f2,CONCAT11(cStack_3f3,cStack_3f4))) ==
                      0x53444e4f &&
                      CONCAT17(cStack_3f5,
                               CONCAT16(cStack_3f6,
                                        CONCAT15(cStack_3f7,
                                                 CONCAT14(cStack_3f8,
                                                          CONCAT13(cStack_3f9,
                                                                   CONCAT12(cStack_3fa,
                                                                            CONCAT11(cStack_3fb,
                                                                                     local_3fc))))))
                              ) == 0x434553205041454c) {
                    uStack_5f0 = 0x15665c;
                    local_5e8 = cVar8;
                    cStack_5e7 = cVar9;
                    cStack_5e6 = cVar10;
                    cStack_5e5 = cVar11;
                    uStack_5e2 = uVar12;
                    uStack_5e1 = uVar13;
                    uStack_5e0 = uVar14;
                    cStack_5d9 = cVar15;
                    uStack_5d0 = uVar16;
                    uStack_5c8 = uVar17;
                    uStack_5c0 = uVar18;
                    uStack_5bf = uVar19;
                    lVar23 = coda_ascii_parse_int64(local_438,6,(int64_t *)local_598,0);
                    lVar22 = local_4a8._8_8_;
                    if (-1 < lVar23) {
                      uStack_5f0 = 0x15667f;
                      pcVar24 = coda_mem_int32_new(*(coda_type_number **)(*plVar1 + 0x148),
                                                   (coda_dynamic_type *)0x0,
                                                   (coda_product *)local_590._8_8_,local_598[0]);
                      pcVar32 = "leap_seconds";
                      goto LAB_00156338;
                    }
                    goto LAB_0015768f;
                  }
                  if (CONCAT17(cStack_3ee,
                               CONCAT16(cStack_3ef,
                                        CONCAT15(cStack_3f0,
                                                 CONCAT14(cStack_3f1,
                                                          CONCAT13(cStack_3f2,
                                                                   CONCAT12(cStack_3f3,
                                                                            CONCAT11(cStack_3f4,
                                                                                     cStack_3f5)))))
                                       )) != 0x534554494c4c4554 ||
                      CONCAT17(cStack_3f5,
                               CONCAT16(cStack_3f6,
                                        CONCAT15(cStack_3f7,
                                                 CONCAT14(cStack_3f8,
                                                          CONCAT13(cStack_3f9,
                                                                   CONCAT12(cStack_3fa,
                                                                            CONCAT11(cStack_3fb,
                                                                                     local_3fc))))))
                              ) != 0x54415320464f2023) {
                    if (CONCAT17(cStack_3ef,
                                 CONCAT16(cStack_3f0,
                                          CONCAT15(cStack_3f1,
                                                   CONCAT14(cStack_3f2,
                                                            CONCAT13(cStack_3f3,
                                                                     CONCAT12(cStack_3f4,
                                                                              CONCAT11(cStack_3f5,
                                                                                       cStack_3f6)))
                                                           )))) == 0x53424f20464f2023 &&
                        CONCAT17(cStack_3f5,
                                 CONCAT16(cStack_3f6,
                                          CONCAT15(cStack_3f7,
                                                   CONCAT14(cStack_3f8,
                                                            CONCAT13(cStack_3f9,
                                                                     CONCAT12(cStack_3fa,
                                                                              CONCAT11(cStack_3fb,
                                                                                       local_3fc))))
                                                  ))) == 0x2023202f204e5250) goto LAB_00156115;
                    local_5e8 = cVar8;
                    cStack_5e7 = cVar9;
                    cStack_5e6 = cVar10;
                    cStack_5e5 = cVar11;
                    uStack_5e2 = uVar12;
                    uStack_5e1 = uVar13;
                    uStack_5e0 = uVar14;
                    cStack_5d9 = cVar15;
                    uStack_5d0 = uVar16;
                    uStack_5c8 = uVar17;
                    uStack_5c0 = uVar18;
                    uStack_5bf = uVar19;
                    if (CONCAT17(cStack_3f0,
                                 CONCAT16(cStack_3f1,
                                          CONCAT15(cStack_3f2,
                                                   CONCAT14(cStack_3f3,
                                                            CONCAT13(cStack_3f4,
                                                                     CONCAT12(cStack_3f5,
                                                                              CONCAT11(cStack_3f6,
                                                                                       cStack_3f7)))
                                                           )))) == 0x5245444145482046 &&
                        CONCAT17(cStack_3f5,
                                 CONCAT16(cStack_3f6,
                                          CONCAT15(cStack_3f7,
                                                   CONCAT14(cStack_3f8,
                                                            CONCAT13(cStack_3f9,
                                                                     CONCAT12(cStack_3fa,
                                                                              CONCAT11(cStack_3fb,
                                                                                       local_3fc))))
                                                  ))) == 0x4820464f20444e45) goto LAB_00157ab4;
LAB_001579b7:
                    pcVar32 = &local_3fc;
                    message = "invalid header item \'%s\' (line: %ld, byte offset: %ld)";
                    lVar22 = local_4a8._8_8_ + 0x3c;
                    goto LAB_0015521f;
                  }
                  uStack_5f0 = 0x1566a4;
                  local_5e8 = cVar8;
                  cStack_5e7 = cVar9;
                  cStack_5e6 = cVar10;
                  cStack_5e5 = cVar11;
                  uStack_5e2 = uVar12;
                  uStack_5e1 = uVar13;
                  uStack_5e0 = uVar14;
                  cStack_5d9 = cVar15;
                  uStack_5d0 = uVar16;
                  uStack_5c8 = uVar17;
                  uStack_5c0 = uVar18;
                  uStack_5bf = uVar19;
                  lVar23 = coda_ascii_parse_int64(local_438,6,(int64_t *)local_598,0);
                  lVar22 = local_4a8._8_8_;
                  if (lVar23 < 0) goto LAB_0015768f;
                  uStack_5f0 = 0x1566c8;
                  pcVar24 = coda_mem_uint16_new(*(coda_type_number **)(*plVar1 + 0x150),
                                                (coda_dynamic_type *)0x0,
                                                (coda_product *)local_590._8_8_,
                                                (uint16_t)local_598[0]);
                  pcVar32 = "num_satellites";
                }
              }
            }
          }
        }
LAB_00156338:
        uStack_5f0 = 0x156342;
        coda_mem_record_add_field
                  ((coda_mem_record *)local_590._16_8_,pcVar32,(coda_dynamic_type *)pcVar24,0);
        cVar8 = local_5e8;
        cVar9 = cStack_5e7;
        cVar10 = cStack_5e6;
        cVar11 = cStack_5e5;
        uVar12 = uStack_5e2;
        uVar13 = uStack_5e1;
        uVar14 = uStack_5e0;
        cVar15 = cStack_5d9;
        uVar16 = uStack_5d0;
        uVar17 = uStack_5c8;
        uVar18 = uStack_5c0;
        uVar19 = uStack_5bf;
LAB_00156115:
        uStack_5bf = uVar19;
        uStack_5c0 = uVar18;
        uStack_5c8 = uVar17;
        uStack_5d0 = uVar16;
        cStack_5d9 = cVar15;
        uStack_5e0 = uVar14;
        uStack_5e1 = uVar13;
        uStack_5e2 = uVar12;
        cStack_5e5 = cVar11;
        cStack_5e6 = cVar10;
        cStack_5e7 = cVar9;
        local_5e8 = cVar8;
        uStack_5f0 = 0x15611f;
        local_4a8._8_8_ = ftell((FILE *)local_590._0_8_);
        local_4a8._0_8_ = local_4a8._0_8_ + 1;
        uStack_5f0 = 0x15613c;
        uVar21 = get_line((FILE *)local_590._0_8_,local_438);
        if ((int)uVar21 < 0) goto LAB_00155226;
        goto LAB_001555ad;
      }
      pcVar32 = "RINEX format version %3.2f is not supported for Clock data";
    }
    else if (uVar21 == 0x4e) {
      if ((dStack_4b8 == 3.0) && (!NAN(dStack_4b8))) {
        lVar22 = 0x3f8;
        goto LAB_00155332;
      }
      pcVar32 = "RINEX format version %3.2f is not supported for Navigation data";
    }
    else {
      if (uVar21 != 0x4f) {
        uStack_5f0 = 0x15531f;
        coda_set_error(-200,"RINEX file type \'%c\' is not supported",
                       (ulong)(uint)(int)(char)uStack_424);
        goto LAB_00155226;
      }
      if ((dStack_4b8 == 3.0) && (!NAN(dStack_4b8))) {
        lVar22 = 0x1a8;
        goto LAB_00155332;
      }
      pcVar32 = "RINEX format version %3.2f is not supported for Observation data";
    }
    uStack_5f0 = 0x155304;
    coda_set_error(-200,pcVar32);
    goto LAB_00155226;
  }
  pcVar32 = &local_3fc;
  lVar22 = local_4a8._8_8_ + 0x3c;
  message = "invalid header item \'%s\' (line: %ld, byte offset: %ld)";
LAB_0015521f:
  uStack_5f0 = 0x155226;
  coda_set_error(-0x16,message,pcVar32,local_4a8._0_8_,lVar22);
LAB_00155226:
  uStack_5f0 = 0x155230;
  ingest_info_cleanup((ingest_info *)local_590);
  return -1;
LAB_001576a2:
  pcVar32 = (char *)(ulong)uVar21;
LAB_00155195:
  message = "header line length (%ld) too short (line: %ld, byte offset: %ld)";
  lVar22 = local_4a8._8_8_;
  goto LAB_0015521f;
}

Assistant:

static int read_file(coda_cdf_product *product_file)
{
    int32_t record_type;
    int64_t gdr_offset;
    int32_t encoding;
    int32_t flags;

    /* CDF Descriptor Record */
    if (read_bytes(product_file->raw_product, 16, 4, &record_type) < 0)
    {
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_int32(&record_type);
#endif
    if (record_type != 1)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid record type (%d) for CDR record", record_type);
        return -1;
    }

    if (read_bytes(product_file->raw_product, 20, 8, &gdr_offset) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, 28, 4, &product_file->cdf_version) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, 32, 4, &product_file->cdf_release) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, 36, 4, &encoding) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, 40, 4, &flags) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, 52, 4, &product_file->cdf_increment) < 0)
    {
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_int64(&gdr_offset);
    swap_int32(&product_file->cdf_version);
    swap_int32(&product_file->cdf_release);
    swap_int32(&encoding);
    swap_int32(&flags);
    swap_int32(&product_file->cdf_increment);
#endif
    if (gdr_offset < 0 || gdr_offset >= product_file->file_size)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid offset for GDR record");
        return -1;
    }

    switch (encoding)
    {
        case 1:        /* NETWORK */
        case 2:        /* SUN */
        case 5:        /* SGi */
        case 7:        /* IBMRS */
        case 9:        /* MAC */
        case 11:       /* HP */
        case 12:       /* NeXT */
            product_file->endianness = coda_big_endian;
            break;
        case 4:        /* DECSTATION */
        case 6:        /* IBMPC */
        case 13:       /* ALPHAOSF1 */
        case 16:       /* ALPHAVMSi */
            product_file->endianness = coda_little_endian;
            break;
        case 3:        /* VAX */
        case 14:       /* ALPHAVMSd */
        case 15:       /* ALPHAVMSg */
            coda_set_error(CODA_ERROR_UNSUPPORTED_PRODUCT, "CDF file contains unsupported floating point format "
                           "(only IEEE 754 floating point format is supported)");
            return -1;
        default:
            coda_set_error(CODA_ERROR_UNSUPPORTED_PRODUCT, "CDF file has unsupported encoding %d", encoding);
            return -1;
    }
    if (flags & 1)
    {
        /* row-major ordering */
        product_file->array_ordering = coda_array_ordering_c;
    }
    else
    {
        /* column-major ordering */
        product_file->array_ordering = coda_array_ordering_fortran;
    }
    if (!(flags & 2))
    {
        coda_set_error(CODA_ERROR_UNSUPPORTED_PRODUCT, "multi-file CDF is not supported");
        return -1;
    }
    product_file->has_md5_chksum = ((flags & 4) && (flags & 8));

    /* Global Descriptor Record */
    if (read_GDR(product_file, gdr_offset) != 0)
    {
        return -1;
    }

    return 0;
}